

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Scene **ppSVar5;
  Scene **ppSVar6;
  Scene **ppSVar7;
  Scene **ppSVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  RTCFeatureFlags RVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined6 uVar40;
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  int iVar62;
  undefined4 uVar63;
  ulong uVar64;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong uVar65;
  ulong uVar66;
  undefined4 uVar71;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  RTCFilterFunctionN p_Var67;
  RTCIntersectArguments *pRVar68;
  RayHitK<4> *pRVar69;
  ulong uVar70;
  RTCIntersectArguments *pRVar72;
  ulong uVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  bool bVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  short sVar82;
  undefined2 uVar124;
  float fVar83;
  uint uVar84;
  float fVar125;
  float fVar127;
  __m128 a_1;
  uint uVar126;
  uint uVar128;
  uint uVar129;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 extraout_var [12];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar130;
  float fVar160;
  float fVar161;
  vfloat4 a;
  undefined1 auVar131 [16];
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar177;
  float fVar178;
  vfloat4 v;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar179;
  float fVar193;
  float fVar194;
  vfloat4 v_1;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar195;
  float fVar206;
  float fVar207;
  undefined1 auVar196 [16];
  undefined4 uVar208;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar209;
  float fVar231;
  float fVar232;
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar233;
  float fVar234;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar235;
  float fVar245;
  float fVar246;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar247;
  float fVar258;
  float fVar259;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar260;
  float fVar267;
  float fVar268;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar269;
  float fVar279;
  float fVar280;
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar281;
  float fVar282;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar283;
  float fVar284;
  float fVar296;
  float fVar298;
  undefined1 auVar285 [16];
  undefined1 auVar288 [16];
  float fVar297;
  float fVar299;
  float fVar300;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar301;
  float fVar302;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar307 [16];
  float fVar311;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar326 [16];
  float fVar334;
  undefined1 auVar327 [16];
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx u_outer1;
  vfloatx u_outer0;
  vboolx valid;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_618 [8];
  float fStack_610;
  float fStack_60c;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_578 [16];
  undefined8 local_548;
  undefined8 uStack_540;
  ulong local_530;
  undefined1 local_528 [4];
  float fStack_524;
  undefined8 uStack_520;
  RTCRayQueryContext *local_518;
  RayHitK<4> *local_510;
  RTCIntersectArguments *local_508;
  uint local_500;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  undefined4 uStack_3fc;
  undefined8 *local_3f8;
  ulong local_3f0;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368 [4];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  Primitive *local_348;
  ulong local_340;
  uint local_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [12];
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 uVar123;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar240 [16];
  undefined1 auVar242 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  
  PVar17 = prim[1];
  uVar64 = (ulong)(byte)PVar17;
  lVar75 = uVar64 * 0x25;
  pPVar9 = prim + lVar75 + 6;
  fVar178 = *(float *)(pPVar9 + 0xc);
  fVar179 = (*(float *)(ray + k * 4) - *(float *)pPVar9) * fVar178;
  fVar193 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar9 + 4)) * fVar178;
  fVar194 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar9 + 8)) * fVar178;
  fVar162 = *(float *)(ray + k * 4 + 0x40) * fVar178;
  fVar177 = *(float *)(ray + k * 4 + 0x50) * fVar178;
  fVar178 = *(float *)(ray + k * 4 + 0x60) * fVar178;
  uVar63 = *(undefined4 *)(prim + uVar64 * 4 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar123),uVar123);
  sVar82 = CONCAT11((char)uVar63,(char)uVar63);
  uVar66 = CONCAT62(uVar40,sVar82);
  auVar274._8_4_ = 0;
  auVar274._0_8_ = uVar66;
  auVar274._12_2_ = uVar124;
  auVar274._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar164._12_4_ = auVar274._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar66;
  auVar164._10_2_ = uVar124;
  auVar85._10_6_ = auVar164._10_6_;
  auVar85._8_2_ = uVar124;
  auVar85._0_8_ = uVar66;
  uVar124 = (undefined2)uVar40;
  auVar41._4_8_ = auVar85._8_8_;
  auVar41._2_2_ = uVar124;
  auVar41._0_2_ = uVar124;
  fVar323 = (float)((int)sVar82 >> 8);
  fVar328 = (float)(auVar41._0_4_ >> 0x18);
  fVar330 = (float)(auVar85._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 5 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar123),uVar123);
  sVar82 = CONCAT11((char)uVar63,(char)uVar63);
  uVar66 = CONCAT62(uVar40,sVar82);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar66;
  auVar133._12_2_ = uVar124;
  auVar133._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar132._12_4_ = auVar133._12_4_;
  auVar132._8_2_ = 0;
  auVar132._0_8_ = uVar66;
  auVar132._10_2_ = uVar124;
  auVar131._10_6_ = auVar132._10_6_;
  auVar131._8_2_ = uVar124;
  auVar131._0_8_ = uVar66;
  uVar124 = (undefined2)uVar40;
  auVar42._4_8_ = auVar131._8_8_;
  auVar42._2_2_ = uVar124;
  auVar42._0_2_ = uVar124;
  fVar195 = (float)((int)sVar82 >> 8);
  fVar206 = (float)(auVar42._0_4_ >> 0x18);
  fVar207 = (float)(auVar131._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 6 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar123),uVar123);
  sVar82 = CONCAT11((char)uVar63,(char)uVar63);
  uVar66 = CONCAT62(uVar40,sVar82);
  auVar136._8_4_ = 0;
  auVar136._0_8_ = uVar66;
  auVar136._12_2_ = uVar124;
  auVar136._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar135._12_4_ = auVar136._12_4_;
  auVar135._8_2_ = 0;
  auVar135._0_8_ = uVar66;
  auVar135._10_2_ = uVar124;
  auVar134._10_6_ = auVar135._10_6_;
  auVar134._8_2_ = uVar124;
  auVar134._0_8_ = uVar66;
  uVar124 = (undefined2)uVar40;
  auVar43._4_8_ = auVar134._8_8_;
  auVar43._2_2_ = uVar124;
  auVar43._0_2_ = uVar124;
  fVar235 = (float)((int)sVar82 >> 8);
  fVar245 = (float)(auVar43._0_4_ >> 0x18);
  fVar246 = (float)(auVar134._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0xf + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar123),uVar123);
  sVar82 = CONCAT11((char)uVar63,(char)uVar63);
  uVar66 = CONCAT62(uVar40,sVar82);
  auVar139._8_4_ = 0;
  auVar139._0_8_ = uVar66;
  auVar139._12_2_ = uVar124;
  auVar139._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar138._12_4_ = auVar139._12_4_;
  auVar138._8_2_ = 0;
  auVar138._0_8_ = uVar66;
  auVar138._10_2_ = uVar124;
  auVar137._10_6_ = auVar138._10_6_;
  auVar137._8_2_ = uVar124;
  auVar137._0_8_ = uVar66;
  uVar124 = (undefined2)uVar40;
  auVar44._4_8_ = auVar137._8_8_;
  auVar44._2_2_ = uVar124;
  auVar44._0_2_ = uVar124;
  fVar83 = (float)((int)sVar82 >> 8);
  fVar125 = (float)(auVar44._0_4_ >> 0x18);
  fVar127 = (float)(auVar137._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar123),uVar123);
  sVar82 = CONCAT11((char)uVar63,(char)uVar63);
  uVar66 = CONCAT62(uVar40,sVar82);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar66;
  auVar212._12_2_ = uVar124;
  auVar212._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar66;
  auVar211._10_2_ = uVar124;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar124;
  auVar210._0_8_ = uVar66;
  uVar124 = (undefined2)uVar40;
  auVar45._4_8_ = auVar210._8_8_;
  auVar45._2_2_ = uVar124;
  auVar45._0_2_ = uVar124;
  fVar247 = (float)((int)sVar82 >> 8);
  fVar258 = (float)(auVar45._0_4_ >> 0x18);
  fVar259 = (float)(auVar210._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar64 + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar123),uVar123);
  sVar82 = CONCAT11((char)uVar63,(char)uVar63);
  uVar66 = CONCAT62(uVar40,sVar82);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar66;
  auVar215._12_2_ = uVar124;
  auVar215._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar66;
  auVar214._10_2_ = uVar124;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar124;
  auVar213._0_8_ = uVar66;
  uVar124 = (undefined2)uVar40;
  auVar46._4_8_ = auVar213._8_8_;
  auVar46._2_2_ = uVar124;
  auVar46._0_2_ = uVar124;
  fVar269 = (float)((int)sVar82 >> 8);
  fVar279 = (float)(auVar46._0_4_ >> 0x18);
  fVar280 = (float)(auVar213._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1a + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar123),uVar123);
  sVar82 = CONCAT11((char)uVar63,(char)uVar63);
  uVar66 = CONCAT62(uVar40,sVar82);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar66;
  auVar218._12_2_ = uVar124;
  auVar218._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar66;
  auVar217._10_2_ = uVar124;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar124;
  auVar216._0_8_ = uVar66;
  uVar124 = (undefined2)uVar40;
  auVar47._4_8_ = auVar216._8_8_;
  auVar47._2_2_ = uVar124;
  auVar47._0_2_ = uVar124;
  fVar260 = (float)((int)sVar82 >> 8);
  fVar267 = (float)(auVar47._0_4_ >> 0x18);
  fVar268 = (float)(auVar216._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1b + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar123),uVar123);
  sVar82 = CONCAT11((char)uVar63,(char)uVar63);
  uVar66 = CONCAT62(uVar40,sVar82);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar66;
  auVar221._12_2_ = uVar124;
  auVar221._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar66;
  auVar220._10_2_ = uVar124;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar124;
  auVar219._0_8_ = uVar66;
  uVar124 = (undefined2)uVar40;
  auVar48._4_8_ = auVar219._8_8_;
  auVar48._2_2_ = uVar124;
  auVar48._0_2_ = uVar124;
  fVar283 = (float)((int)sVar82 >> 8);
  fVar296 = (float)(auVar48._0_4_ >> 0x18);
  fVar298 = (float)(auVar219._8_4_ >> 0x18);
  uVar63 = *(undefined4 *)(prim + uVar64 * 0x1c + 6);
  uVar123 = (undefined1)((uint)uVar63 >> 0x18);
  uVar124 = CONCAT11(uVar123,uVar123);
  uVar123 = (undefined1)((uint)uVar63 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar124,uVar123),CONCAT14(uVar123,uVar63));
  uVar123 = (undefined1)((uint)uVar63 >> 8);
  uVar40 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar123),uVar123);
  sVar82 = CONCAT11((char)uVar63,(char)uVar63);
  uVar66 = CONCAT62(uVar40,sVar82);
  auVar224._8_4_ = 0;
  auVar224._0_8_ = uVar66;
  auVar224._12_2_ = uVar124;
  auVar224._14_2_ = uVar124;
  uVar124 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._8_2_ = 0;
  auVar223._0_8_ = uVar66;
  auVar223._10_2_ = uVar124;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._8_2_ = uVar124;
  auVar222._0_8_ = uVar66;
  uVar124 = (undefined2)uVar40;
  auVar49._4_8_ = auVar222._8_8_;
  auVar49._2_2_ = uVar124;
  auVar49._0_2_ = uVar124;
  fVar130 = (float)((int)sVar82 >> 8);
  fVar160 = (float)(auVar49._0_4_ >> 0x18);
  fVar161 = (float)(auVar222._8_4_ >> 0x18);
  fVar311 = fVar162 * fVar323 + fVar177 * fVar195 + fVar178 * fVar235;
  fVar320 = fVar162 * fVar328 + fVar177 * fVar206 + fVar178 * fVar245;
  fVar321 = fVar162 * fVar330 + fVar177 * fVar207 + fVar178 * fVar246;
  fVar322 = fVar162 * (float)(auVar164._12_4_ >> 0x18) +
            fVar177 * (float)(auVar132._12_4_ >> 0x18) + fVar178 * (float)(auVar135._12_4_ >> 0x18);
  fVar301 = fVar162 * fVar83 + fVar177 * fVar247 + fVar178 * fVar269;
  fVar308 = fVar162 * fVar125 + fVar177 * fVar258 + fVar178 * fVar279;
  fVar309 = fVar162 * fVar127 + fVar177 * fVar259 + fVar178 * fVar280;
  fVar310 = fVar162 * (float)(auVar138._12_4_ >> 0x18) +
            fVar177 * (float)(auVar211._12_4_ >> 0x18) + fVar178 * (float)(auVar214._12_4_ >> 0x18);
  fVar209 = fVar162 * fVar260 + fVar177 * fVar283 + fVar178 * fVar130;
  fVar231 = fVar162 * fVar267 + fVar177 * fVar296 + fVar178 * fVar160;
  fVar232 = fVar162 * fVar268 + fVar177 * fVar298 + fVar178 * fVar161;
  fVar178 = fVar162 * (float)(auVar217._12_4_ >> 0x18) +
            fVar177 * (float)(auVar220._12_4_ >> 0x18) + fVar178 * (float)(auVar223._12_4_ >> 0x18);
  fVar324 = fVar323 * fVar179 + fVar195 * fVar193 + fVar235 * fVar194;
  fVar328 = fVar328 * fVar179 + fVar206 * fVar193 + fVar245 * fVar194;
  fVar330 = fVar330 * fVar179 + fVar207 * fVar193 + fVar246 * fVar194;
  fVar332 = (float)(auVar164._12_4_ >> 0x18) * fVar179 +
            (float)(auVar132._12_4_ >> 0x18) * fVar193 + (float)(auVar135._12_4_ >> 0x18) * fVar194;
  fVar269 = fVar83 * fVar179 + fVar247 * fVar193 + fVar269 * fVar194;
  fVar279 = fVar125 * fVar179 + fVar258 * fVar193 + fVar279 * fVar194;
  fVar280 = fVar127 * fVar179 + fVar259 * fVar193 + fVar280 * fVar194;
  fVar323 = (float)(auVar138._12_4_ >> 0x18) * fVar179 +
            (float)(auVar211._12_4_ >> 0x18) * fVar193 + (float)(auVar214._12_4_ >> 0x18) * fVar194;
  fVar260 = fVar179 * fVar260 + fVar193 * fVar283 + fVar194 * fVar130;
  fVar267 = fVar179 * fVar267 + fVar193 * fVar296 + fVar194 * fVar160;
  fVar268 = fVar179 * fVar268 + fVar193 * fVar298 + fVar194 * fVar161;
  fVar283 = fVar179 * (float)(auVar217._12_4_ >> 0x18) +
            fVar193 * (float)(auVar220._12_4_ >> 0x18) + fVar194 * (float)(auVar223._12_4_ >> 0x18);
  uVar84 = (uint)DAT_01fec6c0;
  uVar126 = DAT_01fec6c0._4_4_;
  uVar128 = DAT_01fec6c0._8_4_;
  uVar129 = DAT_01fec6c0._12_4_;
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar311 & uVar84));
  uVar79 = -(uint)(1e-18 <= (float)((uint)fVar320 & uVar126));
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar321 & uVar128));
  uVar81 = -(uint)(1e-18 <= (float)((uint)fVar322 & uVar129));
  auVar312._0_4_ = (uint)fVar311 & uVar78;
  auVar312._4_4_ = (uint)fVar320 & uVar79;
  auVar312._8_4_ = (uint)fVar321 & uVar80;
  auVar312._12_4_ = (uint)fVar322 & uVar81;
  auVar180._0_8_ = CONCAT44(~uVar79,~uVar78) & 0x219392ef219392ef;
  auVar180._8_4_ = ~uVar80 & 0x219392ef;
  auVar180._12_4_ = ~uVar81 & 0x219392ef;
  auVar180 = auVar180 | auVar312;
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar301 & uVar84));
  uVar79 = -(uint)(1e-18 <= (float)((uint)fVar308 & uVar126));
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar309 & uVar128));
  uVar81 = -(uint)(1e-18 <= (float)((uint)fVar310 & uVar129));
  auVar303._0_4_ = (uint)fVar301 & uVar78;
  auVar303._4_4_ = (uint)fVar308 & uVar79;
  auVar303._8_4_ = (uint)fVar309 & uVar80;
  auVar303._12_4_ = (uint)fVar310 & uVar81;
  auVar236._0_8_ = CONCAT44(~uVar79,~uVar78) & 0x219392ef219392ef;
  auVar236._8_4_ = ~uVar80 & 0x219392ef;
  auVar236._12_4_ = ~uVar81 & 0x219392ef;
  auVar236 = auVar236 | auVar303;
  uVar78 = -(uint)(1e-18 <= (float)((uint)fVar209 & uVar84));
  uVar79 = -(uint)(1e-18 <= (float)((uint)fVar231 & uVar126));
  uVar80 = -(uint)(1e-18 <= (float)((uint)fVar232 & uVar128));
  uVar81 = -(uint)(1e-18 <= (float)((uint)fVar178 & uVar129));
  auVar225._0_4_ = (uint)fVar209 & uVar78;
  auVar225._4_4_ = (uint)fVar231 & uVar79;
  auVar225._8_4_ = (uint)fVar232 & uVar80;
  auVar225._12_4_ = (uint)fVar178 & uVar81;
  auVar248._0_8_ = CONCAT44(~uVar79,~uVar78) & 0x219392ef219392ef;
  auVar248._8_4_ = ~uVar80 & 0x219392ef;
  auVar248._12_4_ = ~uVar81 & 0x219392ef;
  auVar248 = auVar248 | auVar225;
  auVar85 = rcpps(_DAT_01fec6c0,auVar180);
  fVar178 = auVar85._0_4_;
  fVar127 = auVar85._4_4_;
  fVar195 = auVar85._8_4_;
  fVar247 = auVar85._12_4_;
  fVar178 = (1.0 - auVar180._0_4_ * fVar178) * fVar178 + fVar178;
  fVar127 = (1.0 - auVar180._4_4_ * fVar127) * fVar127 + fVar127;
  fVar195 = (1.0 - auVar180._8_4_ * fVar195) * fVar195 + fVar195;
  fVar247 = (1.0 - auVar180._12_4_ * fVar247) * fVar247 + fVar247;
  auVar85 = rcpps(auVar85,auVar236);
  fVar83 = auVar85._0_4_;
  fVar130 = auVar85._4_4_;
  fVar206 = auVar85._8_4_;
  fVar258 = auVar85._12_4_;
  fVar83 = (1.0 - auVar236._0_4_ * fVar83) * fVar83 + fVar83;
  fVar130 = (1.0 - auVar236._4_4_ * fVar130) * fVar130 + fVar130;
  fVar206 = (1.0 - auVar236._8_4_ * fVar206) * fVar206 + fVar206;
  fVar258 = (1.0 - auVar236._12_4_ * fVar258) * fVar258 + fVar258;
  auVar85 = rcpps(auVar85,auVar248);
  fVar125 = auVar85._0_4_;
  fVar160 = auVar85._4_4_;
  fVar207 = auVar85._8_4_;
  fVar259 = auVar85._12_4_;
  fVar125 = (1.0 - auVar248._0_4_ * fVar125) * fVar125 + fVar125;
  fVar160 = (1.0 - auVar248._4_4_ * fVar160) * fVar160 + fVar160;
  fVar207 = (1.0 - auVar248._8_4_ * fVar207) * fVar207 + fVar207;
  fVar259 = (1.0 - auVar248._12_4_ * fVar259) * fVar259 + fVar259;
  fVar296 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar75 + 0x16)) *
            *(float *)(prim + lVar75 + 0x1a);
  uVar66 = *(ulong *)(prim + uVar64 * 7 + 6);
  uVar124 = (undefined2)(uVar66 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar66;
  auVar86._12_2_ = uVar124;
  auVar86._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar66 >> 0x20);
  auVar168._12_4_ = auVar86._12_4_;
  auVar168._8_2_ = 0;
  auVar168._0_8_ = uVar66;
  auVar168._10_2_ = uVar124;
  auVar255._10_6_ = auVar168._10_6_;
  auVar255._8_2_ = uVar124;
  auVar255._0_8_ = uVar66;
  uVar124 = (undefined2)(uVar66 >> 0x10);
  auVar50._4_8_ = auVar255._8_8_;
  auVar50._2_2_ = uVar124;
  auVar50._0_2_ = uVar124;
  fVar161 = (float)(auVar50._0_4_ >> 0x10);
  fVar209 = (float)(auVar255._8_4_ >> 0x10);
  uVar70 = *(ulong *)(prim + uVar64 * 0xb + 6);
  uVar124 = (undefined2)(uVar70 >> 0x30);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar70;
  auVar183._12_2_ = uVar124;
  auVar183._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar70 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar70;
  auVar182._10_2_ = uVar124;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar124;
  auVar181._0_8_ = uVar70;
  uVar124 = (undefined2)(uVar70 >> 0x10);
  auVar51._4_8_ = auVar181._8_8_;
  auVar51._2_2_ = uVar124;
  auVar51._0_2_ = uVar124;
  uVar65 = *(ulong *)(prim + uVar64 * 9 + 6);
  uVar124 = (undefined2)(uVar65 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar65;
  auVar89._12_2_ = uVar124;
  auVar89._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar65 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar65;
  auVar88._10_2_ = uVar124;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar124;
  auVar87._0_8_ = uVar65;
  uVar124 = (undefined2)(uVar65 >> 0x10);
  auVar52._4_8_ = auVar87._8_8_;
  auVar52._2_2_ = uVar124;
  auVar52._0_2_ = uVar124;
  fVar162 = (float)(auVar52._0_4_ >> 0x10);
  fVar231 = (float)(auVar87._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar64 * 0xd + 6);
  uVar124 = (undefined2)(uVar10 >> 0x30);
  auVar251._8_4_ = 0;
  auVar251._0_8_ = uVar10;
  auVar251._12_2_ = uVar124;
  auVar251._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar10 >> 0x20);
  auVar250._12_4_ = auVar251._12_4_;
  auVar250._8_2_ = 0;
  auVar250._0_8_ = uVar10;
  auVar250._10_2_ = uVar124;
  auVar249._10_6_ = auVar250._10_6_;
  auVar249._8_2_ = uVar124;
  auVar249._0_8_ = uVar10;
  uVar124 = (undefined2)(uVar10 >> 0x10);
  auVar53._4_8_ = auVar249._8_8_;
  auVar53._2_2_ = uVar124;
  auVar53._0_2_ = uVar124;
  uVar11 = *(ulong *)(prim + uVar64 * 0x12 + 6);
  uVar124 = (undefined2)(uVar11 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar11;
  auVar92._12_2_ = uVar124;
  auVar92._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar11 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar11;
  auVar91._10_2_ = uVar124;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar124;
  auVar90._0_8_ = uVar11;
  uVar124 = (undefined2)(uVar11 >> 0x10);
  auVar54._4_8_ = auVar90._8_8_;
  auVar54._2_2_ = uVar124;
  auVar54._0_2_ = uVar124;
  fVar177 = (float)(auVar54._0_4_ >> 0x10);
  fVar232 = (float)(auVar90._8_4_ >> 0x10);
  uVar73 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar64 * 2 + uVar73 + 6);
  uVar124 = (undefined2)(uVar12 >> 0x30);
  auVar272._8_4_ = 0;
  auVar272._0_8_ = uVar12;
  auVar272._12_2_ = uVar124;
  auVar272._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar12 >> 0x20);
  auVar271._12_4_ = auVar272._12_4_;
  auVar271._8_2_ = 0;
  auVar271._0_8_ = uVar12;
  auVar271._10_2_ = uVar124;
  auVar270._10_6_ = auVar271._10_6_;
  auVar270._8_2_ = uVar124;
  auVar270._0_8_ = uVar12;
  uVar124 = (undefined2)(uVar12 >> 0x10);
  auVar55._4_8_ = auVar270._8_8_;
  auVar55._2_2_ = uVar124;
  auVar55._0_2_ = uVar124;
  uVar73 = *(ulong *)(prim + uVar73 + 6);
  uVar124 = (undefined2)(uVar73 >> 0x30);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar73;
  auVar95._12_2_ = uVar124;
  auVar95._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar73 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar73;
  auVar94._10_2_ = uVar124;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar124;
  auVar93._0_8_ = uVar73;
  uVar124 = (undefined2)(uVar73 >> 0x10);
  auVar56._4_8_ = auVar93._8_8_;
  auVar56._2_2_ = uVar124;
  auVar56._0_2_ = uVar124;
  fVar179 = (float)(auVar56._0_4_ >> 0x10);
  fVar235 = (float)(auVar93._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar64 * 0x18 + 6);
  uVar124 = (undefined2)(uVar13 >> 0x30);
  auVar287._8_4_ = 0;
  auVar287._0_8_ = uVar13;
  auVar287._12_2_ = uVar124;
  auVar287._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar13 >> 0x20);
  auVar286._12_4_ = auVar287._12_4_;
  auVar286._8_2_ = 0;
  auVar286._0_8_ = uVar13;
  auVar286._10_2_ = uVar124;
  auVar285._10_6_ = auVar286._10_6_;
  auVar285._8_2_ = uVar124;
  auVar285._0_8_ = uVar13;
  uVar124 = (undefined2)(uVar13 >> 0x10);
  auVar57._4_8_ = auVar285._8_8_;
  auVar57._2_2_ = uVar124;
  auVar57._0_2_ = uVar124;
  uVar14 = *(ulong *)(prim + uVar64 * 0x1d + 6);
  uVar124 = (undefined2)(uVar14 >> 0x30);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar14;
  auVar98._12_2_ = uVar124;
  auVar98._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar14 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar14;
  auVar97._10_2_ = uVar124;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar124;
  auVar96._0_8_ = uVar14;
  uVar124 = (undefined2)(uVar14 >> 0x10);
  auVar58._4_8_ = auVar96._8_8_;
  auVar58._2_2_ = uVar124;
  auVar58._0_2_ = uVar124;
  fVar193 = (float)(auVar58._0_4_ >> 0x10);
  fVar245 = (float)(auVar96._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar124 = (undefined2)(uVar15 >> 0x30);
  auVar306._8_4_ = 0;
  auVar306._0_8_ = uVar15;
  auVar306._12_2_ = uVar124;
  auVar306._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar15 >> 0x20);
  auVar305._12_4_ = auVar306._12_4_;
  auVar305._8_2_ = 0;
  auVar305._0_8_ = uVar15;
  auVar305._10_2_ = uVar124;
  auVar304._10_6_ = auVar305._10_6_;
  auVar304._8_2_ = uVar124;
  auVar304._0_8_ = uVar15;
  uVar124 = (undefined2)(uVar15 >> 0x10);
  auVar59._4_8_ = auVar304._8_8_;
  auVar59._2_2_ = uVar124;
  auVar59._0_2_ = uVar124;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar64) + 6);
  uVar124 = (undefined2)(uVar16 >> 0x30);
  auVar101._8_4_ = 0;
  auVar101._0_8_ = uVar16;
  auVar101._12_2_ = uVar124;
  auVar101._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar16 >> 0x20);
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._8_2_ = 0;
  auVar100._0_8_ = uVar16;
  auVar100._10_2_ = uVar124;
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._8_2_ = uVar124;
  auVar99._0_8_ = uVar16;
  uVar124 = (undefined2)(uVar16 >> 0x10);
  auVar60._4_8_ = auVar99._8_8_;
  auVar60._2_2_ = uVar124;
  auVar60._0_2_ = uVar124;
  fVar194 = (float)(auVar60._0_4_ >> 0x10);
  fVar246 = (float)(auVar99._8_4_ >> 0x10);
  uVar64 = *(ulong *)(prim + uVar64 * 0x23 + 6);
  uVar124 = (undefined2)(uVar64 >> 0x30);
  auVar315._8_4_ = 0;
  auVar315._0_8_ = uVar64;
  auVar315._12_2_ = uVar124;
  auVar315._14_2_ = uVar124;
  uVar124 = (undefined2)(uVar64 >> 0x20);
  auVar314._12_4_ = auVar315._12_4_;
  auVar314._8_2_ = 0;
  auVar314._0_8_ = uVar64;
  auVar314._10_2_ = uVar124;
  auVar313._10_6_ = auVar314._10_6_;
  auVar313._8_2_ = uVar124;
  auVar313._0_8_ = uVar64;
  uVar124 = (undefined2)(uVar64 >> 0x10);
  auVar61._4_8_ = auVar313._8_8_;
  auVar61._2_2_ = uVar124;
  auVar61._0_2_ = uVar124;
  auVar184._0_8_ =
       CONCAT44(((((float)(auVar51._0_4_ >> 0x10) - fVar161) * fVar296 + fVar161) - fVar328) *
                fVar127,((((float)(int)(short)uVar70 - (float)(int)(short)uVar66) * fVar296 +
                         (float)(int)(short)uVar66) - fVar324) * fVar178);
  auVar184._8_4_ =
       ((((float)(auVar181._8_4_ >> 0x10) - fVar209) * fVar296 + fVar209) - fVar330) * fVar195;
  auVar184._12_4_ =
       ((((float)(auVar182._12_4_ >> 0x10) - (float)(auVar168._12_4_ >> 0x10)) * fVar296 +
        (float)(auVar168._12_4_ >> 0x10)) - fVar332) * fVar247;
  auVar252._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar65) * fVar296 +
        (float)(int)(short)uVar65) - fVar324) * fVar178;
  auVar252._4_4_ =
       ((((float)(auVar53._0_4_ >> 0x10) - fVar162) * fVar296 + fVar162) - fVar328) * fVar127;
  auVar252._8_4_ =
       ((((float)(auVar249._8_4_ >> 0x10) - fVar231) * fVar296 + fVar231) - fVar330) * fVar195;
  auVar252._12_4_ =
       ((((float)(auVar250._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar296 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar332) * fVar247;
  auVar273._0_8_ =
       CONCAT44(((((float)(auVar55._0_4_ >> 0x10) - fVar177) * fVar296 + fVar177) - fVar279) *
                fVar130,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar296 +
                         (float)(int)(short)uVar11) - fVar269) * fVar83);
  auVar273._8_4_ =
       ((((float)(auVar270._8_4_ >> 0x10) - fVar232) * fVar296 + fVar232) - fVar280) * fVar206;
  auVar273._12_4_ =
       ((((float)(auVar271._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar296 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar323) * fVar258;
  auVar288._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar73) * fVar296 +
        (float)(int)(short)uVar73) - fVar269) * fVar83;
  auVar288._4_4_ =
       ((((float)(auVar57._0_4_ >> 0x10) - fVar179) * fVar296 + fVar179) - fVar279) * fVar130;
  auVar288._8_4_ =
       ((((float)(auVar285._8_4_ >> 0x10) - fVar235) * fVar296 + fVar235) - fVar280) * fVar206;
  auVar288._12_4_ =
       ((((float)(auVar286._12_4_ >> 0x10) - (float)(auVar94._12_4_ >> 0x10)) * fVar296 +
        (float)(auVar94._12_4_ >> 0x10)) - fVar323) * fVar258;
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar307._0_8_ =
       CONCAT44(((((float)(auVar59._0_4_ >> 0x10) - fVar193) * fVar296 + fVar193) - fVar267) *
                fVar160,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar296 +
                         (float)(int)(short)uVar14) - fVar260) * fVar125);
  auVar307._8_4_ =
       ((((float)(auVar304._8_4_ >> 0x10) - fVar245) * fVar296 + fVar245) - fVar268) * fVar207;
  auVar307._12_4_ =
       ((((float)(auVar305._12_4_ >> 0x10) - (float)(auVar97._12_4_ >> 0x10)) * fVar296 +
        (float)(auVar97._12_4_ >> 0x10)) - fVar283) * fVar259;
  auVar316._0_4_ =
       ((((float)(int)(short)uVar64 - (float)(int)(short)uVar16) * fVar296 +
        (float)(int)(short)uVar16) - fVar260) * fVar125;
  auVar316._4_4_ =
       ((((float)(auVar61._0_4_ >> 0x10) - fVar194) * fVar296 + fVar194) - fVar267) * fVar160;
  auVar316._8_4_ =
       ((((float)(auVar313._8_4_ >> 0x10) - fVar246) * fVar296 + fVar246) - fVar268) * fVar207;
  auVar316._12_4_ =
       ((((float)(auVar314._12_4_ >> 0x10) - (float)(auVar100._12_4_ >> 0x10)) * fVar296 +
        (float)(auVar100._12_4_ >> 0x10)) - fVar283) * fVar259;
  auVar163._8_4_ = auVar184._8_4_;
  auVar163._0_8_ = auVar184._0_8_;
  auVar163._12_4_ = auVar184._12_4_;
  auVar164 = minps(auVar163,auVar252);
  auVar140._8_4_ = auVar273._8_4_;
  auVar140._0_8_ = auVar273._0_8_;
  auVar140._12_4_ = auVar273._12_4_;
  auVar85 = minps(auVar140,auVar288);
  auVar164 = maxps(auVar164,auVar85);
  auVar141._8_4_ = auVar307._8_4_;
  auVar141._0_8_ = auVar307._0_8_;
  auVar141._12_4_ = auVar307._12_4_;
  auVar85 = minps(auVar141,auVar316);
  auVar102._4_4_ = uVar63;
  auVar102._0_4_ = uVar63;
  auVar102._8_4_ = uVar63;
  auVar102._12_4_ = uVar63;
  auVar85 = maxps(auVar85,auVar102);
  auVar85 = maxps(auVar164,auVar85);
  auVar164 = maxps(auVar184,auVar252);
  auVar274 = maxps(auVar273,auVar288);
  auVar164 = minps(auVar164,auVar274);
  local_218 = auVar85._0_4_ * 0.99999964;
  fStack_214 = auVar85._4_4_ * 0.99999964;
  fStack_210 = auVar85._8_4_ * 0.99999964;
  fStack_20c = auVar85._12_4_ * 0.99999964;
  auVar85 = maxps(auVar307,auVar316);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar103._4_4_ = uVar63;
  auVar103._0_4_ = uVar63;
  auVar103._8_4_ = uVar63;
  auVar103._12_4_ = uVar63;
  auVar85 = minps(auVar85,auVar103);
  auVar85 = minps(auVar164,auVar85);
  uVar78 = (uint)(byte)PVar17;
  auVar142._0_4_ = -(uint)(uVar78 != 0 && local_218 <= auVar85._0_4_ * 1.0000004);
  auVar142._4_4_ = -(uint)(1 < uVar78 && fStack_214 <= auVar85._4_4_ * 1.0000004);
  auVar142._8_4_ = -(uint)(2 < uVar78 && fStack_210 <= auVar85._8_4_ * 1.0000004);
  auVar142._12_4_ = -(uint)(3 < uVar78 && fStack_20c <= auVar85._12_4_ * 1.0000004);
  uVar78 = movmskps(uVar78,auVar142);
  if (uVar78 == 0) {
    return;
  }
  uVar78 = uVar78 & 0xff;
  local_208._0_12_ = mm_lookupmask_ps._240_12_;
  local_208._12_4_ = 0;
  local_3f8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_348 = prim;
LAB_00bbd672:
  local_340 = (ulong)uVar78;
  lVar75 = 0;
  if (local_340 != 0) {
    for (; (uVar78 >> lVar75 & 1) == 0; lVar75 = lVar75 + 1) {
    }
  }
  uVar78 = *(uint *)(local_348 + 2);
  uVar79 = *(uint *)(local_348 + lVar75 * 4 + 6);
  pGVar18 = (context->scene->geometries).items[uVar78].ptr;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                           (ulong)uVar79 *
                           pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar178 = pGVar18->fnumTimeSegments;
  fVar83 = (pGVar18->time_range).lower;
  fVar125 = ((*(float *)(ray + k * 4 + 0x70) - fVar83) / ((pGVar18->time_range).upper - fVar83)) *
            fVar178;
  fVar83 = floorf(fVar125);
  fVar178 = fVar178 + -1.0;
  if (fVar178 <= fVar83) {
    fVar83 = fVar178;
  }
  fVar178 = 0.0;
  if (0.0 <= fVar83) {
    fVar178 = fVar83;
  }
  _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar74 = (long)(int)fVar178 * 0x38;
  lVar75 = *(long *)(_Var19 + 0x10 + lVar74);
  lVar76 = lVar75 * uVar66;
  lVar20 = *(long *)(_Var19 + 0x38 + lVar74);
  lVar21 = *(long *)(_Var19 + 0x48 + lVar74);
  pfVar1 = (float *)(lVar20 + uVar66 * lVar21);
  pfVar2 = (float *)(lVar20 + (uVar66 + 1) * lVar21);
  pfVar3 = (float *)(lVar20 + (uVar66 + 2) * lVar21);
  fVar125 = fVar125 - fVar178;
  fVar162 = 1.0 - fVar125;
  pfVar4 = (float *)(lVar20 + lVar21 * (uVar66 + 3));
  pRVar72 = *(RTCIntersectArguments **)(_Var19 + lVar74);
  ppSVar5 = (Scene **)((long)&pRVar72->flags + lVar76);
  ppSVar6 = (Scene **)((long)&pRVar72->flags + lVar75 * (uVar66 + 1));
  ppSVar7 = (Scene **)((long)&pRVar72->flags + lVar75 * (uVar66 + 2));
  fVar177 = *(float *)ppSVar5 * fVar162 + *pfVar1 * fVar125;
  fVar179 = *(float *)((long)ppSVar5 + 4) * fVar162 + pfVar1[1] * fVar125;
  fVar193 = *(float *)(ppSVar5 + 1) * fVar162 + pfVar1[2] * fVar125;
  local_178 = *(float *)ppSVar6 * fVar162 + *pfVar2 * fVar125;
  local_188 = *(float *)((long)ppSVar6 + 4) * fVar162 + pfVar2[1] * fVar125;
  local_2d8 = *(float *)(ppSVar6 + 1) * fVar162 + pfVar2[2] * fVar125;
  local_198 = *(float *)ppSVar7 * fVar162 + *pfVar3 * fVar125;
  local_1a8 = *(float *)((long)ppSVar7 + 4) * fVar162 + pfVar3[1] * fVar125;
  local_2f8 = *(float *)(ppSVar7 + 1) * fVar162 + pfVar3[2] * fVar125;
  ppSVar8 = (Scene **)((long)&pRVar72->flags + lVar75 * (uVar66 + 3));
  local_608._0_4_ = fVar162 * *(float *)ppSVar8 + fVar125 * *pfVar4;
  local_608._4_4_ = fVar162 * *(float *)((long)ppSVar8 + 4) + fVar125 * pfVar4[1];
  fStack_600 = fVar162 * *(float *)(ppSVar8 + 1) + fVar125 * pfVar4[2];
  fStack_11c = *(float *)(ray + k * 4 + 0x40);
  local_4e8 = *(float *)(ray + k * 4 + 0x50);
  fVar83 = *(float *)(ray + k * 4 + 0x60);
  fVar178 = local_4e8 * local_4e8;
  fVar127 = fVar83 * fVar83;
  fVar161 = fVar178 + fStack_11c * fStack_11c + fVar127;
  local_3d8._0_8_ = CONCAT44(fVar178 + fVar178 + 0.0,fVar161);
  local_3d8._8_4_ = fVar178 + fVar127 + fVar127;
  local_3d8._12_4_ = fVar178 + 0.0 + 0.0;
  auVar196._8_4_ = local_3d8._8_4_;
  auVar196._0_8_ = local_3d8._0_8_;
  auVar196._12_4_ = local_3d8._12_4_;
  auVar85 = rcpss(auVar196,local_3d8);
  local_468 = (2.0 - fVar161 * auVar85._0_4_) * auVar85._0_4_ *
              (((fVar193 + local_2d8 + local_2f8 + fStack_600) * 0.25 -
               *(float *)(ray + k * 4 + 0x20)) * fVar83 +
              ((fVar179 + local_188 + local_1a8 + (float)local_608._4_4_) * 0.25 -
              *(float *)(ray + k * 4 + 0x10)) * local_4e8 +
              ((fVar177 + local_178 + local_198 + (float)local_608._0_4_) * 0.25 -
              *(float *)(ray + k * 4)) * fStack_11c);
  local_3c8._4_4_ = local_4e8;
  local_3c8._0_4_ = fStack_11c;
  fStack_3c0 = fVar83;
  fStack_3bc = 0.0;
  fStack_464 = local_468;
  fStack_460 = local_468;
  fStack_45c = local_468;
  fVar178 = fStack_11c * local_468 + *(float *)(ray + k * 4);
  fVar130 = local_4e8 * local_468 + *(float *)(ray + k * 4 + 0x10);
  fVar160 = fVar83 * local_468 + *(float *)(ray + k * 4 + 0x20);
  fVar177 = fVar177 - fVar178;
  fVar179 = fVar179 - fVar130;
  fVar193 = fVar193 - fVar160;
  fVar194 = (*(float *)((long)ppSVar5 + 0xc) * fVar162 + pfVar1[3] * fVar125) - 0.0;
  local_198 = local_198 - fVar178;
  local_1a8 = local_1a8 - fVar130;
  local_2f8 = local_2f8 - fVar160;
  fStack_4cc = (*(float *)((long)ppSVar7 + 0xc) * fVar162 + pfVar3[3] * fVar125) - 0.0;
  local_178 = local_178 - fVar178;
  local_188 = local_188 - fVar130;
  local_2d8 = local_2d8 - fVar160;
  fStack_4bc = (*(float *)((long)ppSVar6 + 0xc) * fVar162 + pfVar2[3] * fVar125) - 0.0;
  local_608._0_4_ = (float)local_608._0_4_ - fVar178;
  local_608._4_4_ = (float)local_608._4_4_ - fVar130;
  fStack_600 = fStack_600 - fVar160;
  fStack_5fc = (fVar162 * *(float *)((long)ppSVar8 + 0xc) + fVar125 * pfVar4[3]) - 0.0;
  local_138 = fVar177;
  fStack_134 = fVar177;
  fStack_130 = fVar177;
  fStack_12c = fVar177;
  local_148 = fVar179;
  fStack_144 = fVar179;
  fStack_140 = fVar179;
  fStack_13c = fVar179;
  local_158 = fVar193;
  fStack_154 = fVar193;
  fStack_150 = fVar193;
  fStack_14c = fVar193;
  fVar178 = local_4e8 * local_4e8;
  local_168 = fVar194;
  fStack_164 = fVar194;
  fStack_160 = fVar194;
  fStack_15c = fVar194;
  fStack_11c = fStack_11c * fStack_11c;
  local_128 = fStack_11c + fVar178 + fVar127;
  fStack_124 = fStack_11c + fVar178 + fVar127;
  fStack_120 = fStack_11c + fVar178 + fVar127;
  fStack_11c = fStack_11c + fVar178 + fVar127;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  fStack_2d4 = local_2d8;
  fStack_2d0 = local_2d8;
  fStack_2cc = local_2d8;
  local_4c8 = local_178;
  fStack_4c4 = local_188;
  fStack_4c0 = local_2d8;
  local_2e8 = fStack_4bc;
  fStack_2e4 = fStack_4bc;
  fStack_2e0 = fStack_4bc;
  fStack_2dc = fStack_4bc;
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_1a4 = local_1a8;
  fStack_1a0 = local_1a8;
  fStack_19c = local_1a8;
  fStack_2f4 = local_2f8;
  fStack_2f0 = local_2f8;
  fStack_2ec = local_2f8;
  local_4d8 = local_198;
  fStack_4d4 = local_1a8;
  fStack_4d0 = local_2f8;
  local_308 = fStack_4cc;
  fStack_304 = fStack_4cc;
  fStack_300 = fStack_4cc;
  fStack_2fc = fStack_4cc;
  local_1b8 = (float)local_608._0_4_;
  fStack_1b4 = (float)local_608._0_4_;
  fStack_1b0 = (float)local_608._0_4_;
  fStack_1ac = (float)local_608._0_4_;
  local_1c8 = (float)local_608._4_4_;
  fStack_1c4 = (float)local_608._4_4_;
  fStack_1c0 = (float)local_608._4_4_;
  fStack_1bc = (float)local_608._4_4_;
  local_1d8 = fStack_600;
  fStack_1d4 = fStack_600;
  fStack_1d0 = fStack_600;
  fStack_1cc = fStack_600;
  local_1e8 = fStack_5fc;
  fStack_1e4 = fStack_5fc;
  fStack_1e0 = fStack_5fc;
  fStack_1dc = fStack_5fc;
  local_488 = *(float *)(ray + k * 4 + 0x40);
  local_318 = ABS(local_128);
  fStack_314 = ABS(fStack_124);
  fStack_310 = ABS(fStack_120);
  fStack_30c = ABS(fStack_11c);
  fVar178 = *(float *)(ray + k * 4 + 0x30);
  local_378 = ZEXT416((uint)local_468);
  local_1f8 = fVar178 - local_468;
  fStack_1f4 = local_1f8;
  fStack_1f0 = local_1f8;
  fStack_1ec = local_1f8;
  local_328 = uVar78;
  uStack_324 = uVar78;
  uStack_320 = uVar78;
  uStack_31c = uVar78;
  local_3f0 = (ulong)uVar79;
  local_338 = uVar79;
  uStack_334 = uVar79;
  uStack_330 = uVar79;
  uStack_32c = uVar79;
  uVar70 = 0;
  local_530 = 1;
  fVar125 = 0.0;
  fVar127 = 1.0;
  uVar63 = 0;
  uVar208 = 0;
  fStack_4e4 = local_4e8;
  fStack_4e0 = local_4e8;
  fStack_4dc = local_4e8;
  fStack_484 = local_488;
  fStack_480 = local_488;
  fStack_47c = local_488;
  uVar66 = 1;
  do {
    local_418 = fVar127 - fVar125;
    local_498 = fVar125;
    fStack_494 = fVar127;
    uStack_490 = uVar63;
    uStack_48c = uVar208;
    fStack_414 = local_418;
    fStack_410 = local_418;
    fStack_40c = local_418;
    local_428 = fVar125;
    fStack_424 = fVar125;
    fStack_420 = fVar125;
    fStack_41c = fVar125;
    fVar195 = local_418 * 0.0 + fVar125;
    fVar206 = local_418 * 0.33333334 + fVar125;
    fVar207 = local_418 * 0.6666667 + fVar125;
    fVar209 = local_418 * 1.0 + fVar125;
    fVar231 = (float)DAT_01feca10;
    fVar232 = fVar231 - fVar195;
    fVar235 = DAT_01feca10._4_4_;
    fVar245 = fVar235 - fVar206;
    fVar246 = DAT_01feca10._8_4_;
    fVar258 = DAT_01feca10._12_4_;
    fVar247 = fVar246 - fVar207;
    fVar259 = fVar258 - fVar209;
    fVar330 = local_178 * fVar232 + local_198 * fVar195;
    fVar332 = fStack_174 * fVar245 + fStack_194 * fVar206;
    fVar281 = fStack_170 * fVar247 + fStack_190 * fVar207;
    fVar282 = fStack_16c * fVar259 + fStack_18c * fVar209;
    fVar284 = local_188 * fVar232 + local_1a8 * fVar195;
    fVar297 = fStack_184 * fVar245 + fStack_1a4 * fVar206;
    fVar299 = fStack_180 * fVar247 + fStack_1a0 * fVar207;
    fVar300 = fStack_17c * fVar259 + fStack_19c * fVar209;
    fVar260 = local_2d8 * fVar232 + local_2f8 * fVar195;
    fVar267 = fStack_2d4 * fVar245 + fStack_2f4 * fVar206;
    fVar268 = fStack_2d0 * fVar247 + fStack_2f0 * fVar207;
    fVar283 = fStack_2cc * fVar259 + fStack_2ec * fVar209;
    fVar321 = local_2e8 * fVar232 + local_308 * fVar195;
    fVar322 = fStack_2e4 * fVar245 + fStack_304 * fVar206;
    fVar324 = fStack_2e0 * fVar247 + fStack_300 * fVar207;
    fVar328 = fStack_2dc * fVar259 + fStack_2fc * fVar209;
    fVar269 = (local_138 * fVar232 + local_178 * fVar195) * fVar232 + fVar195 * fVar330;
    fVar279 = (fStack_134 * fVar245 + fStack_174 * fVar206) * fVar245 + fVar206 * fVar332;
    fVar280 = (fStack_130 * fVar247 + fStack_170 * fVar207) * fVar247 + fVar207 * fVar281;
    fVar323 = (fStack_12c * fVar259 + fStack_16c * fVar209) * fVar259 + fVar209 * fVar282;
    fVar127 = (local_148 * fVar232 + local_188 * fVar195) * fVar232 + fVar195 * fVar284;
    fVar130 = (fStack_144 * fVar245 + fStack_184 * fVar206) * fVar245 + fVar206 * fVar297;
    fVar160 = (fStack_140 * fVar247 + fStack_180 * fVar207) * fVar247 + fVar207 * fVar299;
    fVar162 = (fStack_13c * fVar259 + fStack_17c * fVar209) * fVar259 + fVar209 * fVar300;
    fVar296 = (local_158 * fVar232 + local_2d8 * fVar195) * fVar232 + fVar195 * fVar260;
    fVar298 = (fStack_154 * fVar245 + fStack_2d4 * fVar206) * fVar245 + fVar206 * fVar267;
    fVar301 = (fStack_150 * fVar247 + fStack_2d0 * fVar207) * fVar247 + fVar207 * fVar268;
    fVar308 = (fStack_14c * fVar259 + fStack_2cc * fVar209) * fVar259 + fVar209 * fVar283;
    fVar309 = (local_168 * fVar232 + local_2e8 * fVar195) * fVar232 + fVar195 * fVar321;
    fVar310 = (fStack_164 * fVar245 + fStack_2e4 * fVar206) * fVar245 + fVar206 * fVar322;
    fVar311 = (fStack_160 * fVar247 + fStack_2e0 * fVar207) * fVar247 + fVar207 * fVar324;
    fVar320 = (fStack_15c * fVar259 + fStack_2dc * fVar209) * fVar259 + fVar209 * fVar328;
    fVar330 = fVar330 * fVar232 + (local_198 * fVar232 + local_1b8 * fVar195) * fVar195;
    fVar332 = fVar332 * fVar245 + (fStack_194 * fVar245 + fStack_1b4 * fVar206) * fVar206;
    fVar281 = fVar281 * fVar247 + (fStack_190 * fVar247 + fStack_1b0 * fVar207) * fVar207;
    fVar282 = fVar282 * fVar259 + (fStack_18c * fVar259 + fStack_1ac * fVar209) * fVar209;
    fVar284 = fVar284 * fVar232 + (local_1a8 * fVar232 + local_1c8 * fVar195) * fVar195;
    fVar297 = fVar297 * fVar245 + (fStack_1a4 * fVar245 + fStack_1c4 * fVar206) * fVar206;
    fVar299 = fVar299 * fVar247 + (fStack_1a0 * fVar247 + fStack_1c0 * fVar207) * fVar207;
    fVar300 = fVar300 * fVar259 + (fStack_19c * fVar259 + fStack_1bc * fVar209) * fVar209;
    fVar260 = fVar260 * fVar232 + (local_2f8 * fVar232 + local_1d8 * fVar195) * fVar195;
    fVar267 = fVar267 * fVar245 + (fStack_2f4 * fVar245 + fStack_1d4 * fVar206) * fVar206;
    fVar268 = fVar268 * fVar247 + (fStack_2f0 * fVar247 + fStack_1d0 * fVar207) * fVar207;
    fVar283 = fVar283 * fVar259 + (fStack_2ec * fVar259 + fStack_1cc * fVar209) * fVar209;
    fVar321 = fVar321 * fVar232 + (local_308 * fVar232 + local_1e8 * fVar195) * fVar195;
    fVar322 = fVar322 * fVar245 + (fStack_304 * fVar245 + fStack_1e4 * fVar206) * fVar206;
    fVar324 = fVar324 * fVar247 + (fStack_300 * fVar247 + fStack_1e0 * fVar207) * fVar207;
    fVar328 = fVar328 * fVar259 + (fStack_2fc * fVar259 + fStack_1dc * fVar209) * fVar209;
    fVar325 = fVar232 * fVar269 + fVar195 * fVar330;
    fVar329 = fVar245 * fVar279 + fVar206 * fVar332;
    fVar331 = fVar247 * fVar280 + fVar207 * fVar281;
    fVar333 = fVar259 * fVar323 + fVar209 * fVar282;
    fVar335 = fVar232 * fVar127 + fVar195 * fVar284;
    fVar336 = fVar245 * fVar130 + fVar206 * fVar297;
    fVar337 = fVar247 * fVar160 + fVar207 * fVar299;
    fVar338 = fVar259 * fVar162 + fVar209 * fVar300;
    fVar340 = fVar232 * fVar296 + fVar195 * fVar260;
    fVar342 = fVar245 * fVar298 + fVar206 * fVar267;
    fVar344 = fVar247 * fVar301 + fVar207 * fVar268;
    fVar346 = fVar259 * fVar308 + fVar209 * fVar283;
    fVar302 = local_418 * 0.11111111;
    fVar195 = fVar232 * fVar309 + fVar195 * fVar321;
    fVar206 = fVar245 * fVar310 + fVar206 * fVar322;
    auVar165._0_8_ = CONCAT44(fVar206,fVar195);
    auVar165._8_4_ = fVar247 * fVar311 + fVar207 * fVar324;
    auVar165._12_4_ = fVar259 * fVar320 + fVar209 * fVar328;
    fVar330 = (fVar330 - fVar269) * 3.0 * fVar302;
    fVar332 = (fVar332 - fVar279) * 3.0 * fVar302;
    fVar281 = (fVar281 - fVar280) * 3.0 * fVar302;
    fVar282 = (fVar282 - fVar323) * 3.0 * fVar302;
    fVar284 = (fVar284 - fVar127) * 3.0 * fVar302;
    fVar297 = (fVar297 - fVar130) * 3.0 * fVar302;
    fVar299 = (fVar299 - fVar160) * 3.0 * fVar302;
    fVar300 = (fVar300 - fVar162) * 3.0 * fVar302;
    fVar245 = (fVar260 - fVar296) * 3.0 * fVar302;
    local_408 = (fVar267 - fVar298) * 3.0 * fVar302;
    fStack_404 = (fVar268 - fVar301) * 3.0 * fVar302;
    fStack_400 = (fVar283 - fVar308) * 3.0 * fVar302;
    fVar283 = fVar302 * (fVar322 - fVar310) * 3.0;
    fVar296 = fVar302 * (fVar324 - fVar311) * 3.0;
    fVar298 = fVar302 * (fVar328 - fVar320) * 3.0;
    auVar143._4_4_ = auVar165._8_4_;
    auVar143._0_4_ = fVar206;
    auVar143._8_4_ = auVar165._12_4_;
    auVar143._12_4_ = 0;
    auVar144._0_8_ = CONCAT44(auVar165._8_4_ - fVar296,fVar206 - fVar283);
    auVar144._8_4_ = auVar165._12_4_ - fVar298;
    auVar144._12_4_ = 0;
    local_458 = fVar336 - fVar335;
    fStack_454 = fVar337 - fVar336;
    fStack_450 = fVar338 - fVar337;
    fStack_44c = 0.0 - fVar338;
    local_478 = fVar342 - fVar340;
    fStack_474 = fVar344 - fVar342;
    fStack_470 = fVar346 - fVar344;
    fStack_46c = 0.0 - fVar346;
    fVar127 = fVar284 * local_478 - fVar245 * local_458;
    fVar130 = fVar297 * fStack_474 - local_408 * fStack_454;
    fVar160 = fVar299 * fStack_470 - fStack_404 * fStack_450;
    fVar162 = fVar300 * fStack_46c - fStack_400 * fStack_44c;
    local_4a8._0_4_ = fVar329 - fVar325;
    local_4a8._4_4_ = fVar331 - fVar329;
    fStack_4a0 = fVar333 - fVar331;
    fStack_49c = 0.0 - fVar333;
    fVar207 = fVar245 * (float)local_4a8._0_4_ - fVar330 * local_478;
    fVar232 = local_408 * (float)local_4a8._4_4_ - fVar332 * fStack_474;
    fVar259 = fStack_404 * fStack_4a0 - fVar281 * fStack_470;
    fVar279 = fStack_400 * fStack_49c - fVar282 * fStack_46c;
    fVar209 = fVar330 * local_458 - fVar284 * (float)local_4a8._0_4_;
    fVar247 = fVar332 * fStack_454 - fVar297 * (float)local_4a8._4_4_;
    fVar269 = fVar281 * fStack_450 - fVar299 * fStack_4a0;
    fVar280 = fVar282 * fStack_44c - fVar300 * fStack_49c;
    auVar253._0_4_ = fVar209 * fVar209;
    auVar253._4_4_ = fVar247 * fVar247;
    auVar253._8_4_ = fVar269 * fVar269;
    auVar253._12_4_ = fVar280 * fVar280;
    auVar185._0_4_ =
         (float)local_4a8._0_4_ * (float)local_4a8._0_4_ +
         local_458 * local_458 + local_478 * local_478;
    auVar185._4_4_ =
         (float)local_4a8._4_4_ * (float)local_4a8._4_4_ +
         fStack_454 * fStack_454 + fStack_474 * fStack_474;
    auVar185._8_4_ = fStack_4a0 * fStack_4a0 + fStack_450 * fStack_450 + fStack_470 * fStack_470;
    auVar185._12_4_ = fStack_49c * fStack_49c + fStack_44c * fStack_44c + fStack_46c * fStack_46c;
    auVar85 = rcpps(auVar253,auVar185);
    fVar209 = auVar85._0_4_;
    fVar247 = auVar85._4_4_;
    fVar269 = auVar85._8_4_;
    fVar280 = auVar85._12_4_;
    fVar209 = (1.0 - fVar209 * auVar185._0_4_) * fVar209 + fVar209;
    fVar247 = (1.0 - fVar247 * auVar185._4_4_) * fVar247 + fVar247;
    fVar269 = (1.0 - fVar269 * auVar185._8_4_) * fVar269 + fVar269;
    fVar280 = (1.0 - fVar280 * auVar185._12_4_) * fVar280 + fVar280;
    fVar323 = local_478 * fVar297 - local_458 * local_408;
    fVar260 = fStack_474 * fVar299 - fStack_454 * fStack_404;
    fVar267 = fStack_470 * fVar300 - fStack_450 * fStack_400;
    fVar268 = fStack_46c * 0.0 - fStack_44c * 0.0;
    uStack_3fc = 0;
    fVar301 = (float)local_4a8._0_4_ * local_408 - local_478 * fVar332;
    fVar308 = (float)local_4a8._4_4_ * fStack_404 - fStack_474 * fVar281;
    fVar310 = fStack_4a0 * fStack_400 - fStack_470 * fVar282;
    fVar311 = fStack_49c * 0.0 - fStack_46c * 0.0;
    fVar320 = local_458 * fVar332 - (float)local_4a8._0_4_ * fVar297;
    fVar322 = fStack_454 * fVar281 - (float)local_4a8._4_4_ * fVar299;
    fVar324 = fStack_450 * fVar282 - fStack_4a0 * fVar300;
    fVar328 = fStack_44c * 0.0 - fStack_49c * 0.0;
    auVar326._0_4_ = fVar320 * fVar320;
    auVar326._4_4_ = fVar322 * fVar322;
    auVar326._8_4_ = fVar324 * fVar324;
    auVar326._12_4_ = fVar328 * fVar328;
    auVar104._0_4_ = (fVar127 * fVar127 + fVar207 * fVar207 + auVar253._0_4_) * fVar209;
    auVar104._4_4_ = (fVar130 * fVar130 + fVar232 * fVar232 + auVar253._4_4_) * fVar247;
    auVar104._8_4_ = (fVar160 * fVar160 + fVar259 * fVar259 + auVar253._8_4_) * fVar269;
    auVar104._12_4_ = (fVar162 * fVar162 + fVar279 * fVar279 + auVar253._12_4_) * fVar280;
    auVar261._0_4_ = (fVar323 * fVar323 + fVar301 * fVar301 + auVar326._0_4_) * fVar209;
    auVar261._4_4_ = (fVar260 * fVar260 + fVar308 * fVar308 + auVar326._4_4_) * fVar247;
    auVar261._8_4_ = (fVar267 * fVar267 + fVar310 * fVar310 + auVar326._8_4_) * fVar269;
    auVar261._12_4_ = (fVar268 * fVar268 + fVar311 * fVar311 + auVar326._12_4_) * fVar280;
    auVar85 = maxps(auVar104,auVar261);
    auVar254._8_4_ = auVar165._8_4_;
    auVar254._0_8_ = auVar165._0_8_;
    auVar254._12_4_ = auVar165._12_4_;
    auVar27._4_4_ = fVar206 + fVar283;
    auVar27._0_4_ = fVar195 + fVar302 * (fVar321 - fVar309) * 3.0;
    auVar27._8_4_ = auVar165._8_4_ + fVar296;
    auVar27._12_4_ = auVar165._12_4_ + fVar298;
    auVar274 = maxps(auVar254,auVar27);
    auVar226._8_4_ = auVar144._8_4_;
    auVar226._0_8_ = auVar144._0_8_;
    auVar226._12_4_ = 0;
    auVar164 = maxps(auVar226,auVar143);
    auVar255 = maxps(auVar274,auVar164);
    auVar274 = minps(auVar165,auVar27);
    auVar164 = minps(auVar144,auVar143);
    auVar164 = minps(auVar274,auVar164);
    auVar85 = sqrtps(auVar85,auVar85);
    auVar274 = rsqrtps(auVar326,auVar185);
    fVar127 = auVar274._0_4_;
    fVar130 = auVar274._4_4_;
    fVar160 = auVar274._8_4_;
    fVar162 = auVar274._12_4_;
    fVar206 = fVar127 * fVar127 * auVar185._0_4_ * -0.5 * fVar127 + fVar127 * 1.5;
    fVar207 = fVar130 * fVar130 * auVar185._4_4_ * -0.5 * fVar130 + fVar130 * 1.5;
    fVar209 = fVar160 * fVar160 * auVar185._8_4_ * -0.5 * fVar160 + fVar160 * 1.5;
    fVar232 = fVar162 * fVar162 * auVar185._12_4_ * -0.5 * fVar162 + fVar162 * 1.5;
    fVar130 = 0.0 - fVar335;
    fVar160 = 0.0 - fVar336;
    fVar162 = 0.0 - fVar337;
    fVar195 = 0.0 - fVar338;
    fVar267 = 0.0 - fVar340;
    fVar268 = 0.0 - fVar342;
    fVar283 = 0.0 - fVar344;
    fVar296 = 0.0 - fVar346;
    fVar311 = 0.0 - fVar325;
    fVar320 = 0.0 - fVar329;
    fVar321 = 0.0 - fVar331;
    fVar322 = 0.0 - fVar333;
    fVar341 = local_488 * (float)local_4a8._0_4_ * fVar206 +
              local_4e8 * local_458 * fVar206 + fVar83 * local_478 * fVar206;
    fVar343 = fStack_484 * (float)local_4a8._4_4_ * fVar207 +
              fStack_4e4 * fStack_454 * fVar207 + fVar83 * fStack_474 * fVar207;
    fVar345 = fStack_480 * fStack_4a0 * fVar209 +
              fStack_4e0 * fStack_450 * fVar209 + fVar83 * fStack_470 * fVar209;
    fVar347 = fStack_47c * fStack_49c * fVar232 +
              fStack_4dc * fStack_44c * fVar232 + fVar83 * fStack_46c * fVar232;
    fVar324 = (float)local_4a8._0_4_ * fVar206 * fVar311 +
              local_458 * fVar206 * fVar130 + local_478 * fVar206 * fVar267;
    fVar328 = (float)local_4a8._4_4_ * fVar207 * fVar320 +
              fStack_454 * fVar207 * fVar160 + fStack_474 * fVar207 * fVar268;
    fVar302 = fStack_4a0 * fVar209 * fVar321 +
              fStack_450 * fVar209 * fVar162 + fStack_470 * fVar209 * fVar283;
    fVar339 = fStack_49c * fVar232 * fVar322 +
              fStack_44c * fVar232 * fVar195 + fStack_46c * fVar232 * fVar296;
    fVar298 = (local_488 * fVar311 + local_4e8 * fVar130 + fVar83 * fVar267) - fVar341 * fVar324;
    fVar301 = (fStack_484 * fVar320 + fStack_4e4 * fVar160 + fVar83 * fVar268) - fVar343 * fVar328;
    fVar308 = (fStack_480 * fVar321 + fStack_4e0 * fVar162 + fVar83 * fVar283) - fVar345 * fVar302;
    fVar309 = (fStack_47c * fVar322 + fStack_4dc * fVar195 + fVar83 * fVar296) - fVar347 * fVar339;
    fVar279 = (fVar311 * fVar311 + fVar130 * fVar130 + fVar267 * fVar267) - fVar324 * fVar324;
    fVar280 = (fVar320 * fVar320 + fVar160 * fVar160 + fVar268 * fVar268) - fVar328 * fVar328;
    fVar323 = (fVar321 * fVar321 + fVar162 * fVar162 + fVar283 * fVar283) - fVar302 * fVar302;
    fVar260 = (fVar322 * fVar322 + fVar195 * fVar195 + fVar296 * fVar296) - fVar339 * fVar339;
    fVar127 = (auVar255._0_4_ + auVar85._0_4_) * 1.0000002;
    fVar247 = (auVar255._4_4_ + auVar85._4_4_) * 1.0000002;
    fVar259 = (auVar255._8_4_ + auVar85._8_4_) * 1.0000002;
    fVar269 = (auVar255._12_4_ + auVar85._12_4_) * 1.0000002;
    auVar227._0_4_ = fVar279 - fVar127 * fVar127;
    auVar227._4_4_ = fVar280 - fVar247 * fVar247;
    auVar227._8_4_ = fVar323 - fVar259 * fVar259;
    auVar227._12_4_ = fVar260 - fVar269 * fVar269;
    local_4b8._0_4_ = fVar341 * fVar341;
    local_4b8._4_4_ = fVar343 * fVar343;
    fStack_4b0 = fVar345 * fVar345;
    fStack_4ac = fVar347 * fVar347;
    fVar247 = local_128 - (float)local_4b8._0_4_;
    fVar259 = fStack_124 - (float)local_4b8._4_4_;
    fVar269 = fStack_120 - fStack_4b0;
    fVar310 = fStack_11c - fStack_4ac;
    local_4f8._0_4_ = fVar298 + fVar298;
    local_4f8._4_4_ = fVar301 + fVar301;
    fStack_4f0 = fVar308 + fVar308;
    fStack_4ec = fVar309 + fVar309;
    local_438 = (float)local_4f8._0_4_ * (float)local_4f8._0_4_;
    fStack_434 = (float)local_4f8._4_4_ * (float)local_4f8._4_4_;
    fStack_430 = fStack_4f0 * fStack_4f0;
    fStack_42c = fStack_4ec * fStack_4ec;
    auVar256._0_4_ = local_438 - fVar247 * 4.0 * auVar227._0_4_;
    auVar256._4_4_ = fStack_434 - fVar259 * 4.0 * auVar227._4_4_;
    auVar256._8_4_ = fStack_430 - fVar269 * 4.0 * auVar227._8_4_;
    auVar256._12_4_ = fStack_42c - fVar310 * 4.0 * auVar227._12_4_;
    local_448._4_4_ = (auVar164._4_4_ - auVar85._4_4_) * 0.99999976;
    local_448._0_4_ = (auVar164._0_4_ - auVar85._0_4_) * 0.99999976;
    fStack_440 = (auVar164._8_4_ - auVar85._8_4_) * 0.99999976;
    fStack_43c = (auVar164._12_4_ - auVar85._12_4_) * 0.99999976;
    auVar289._4_4_ = -(uint)(0.0 <= auVar256._4_4_);
    auVar289._0_4_ = -(uint)(0.0 <= auVar256._0_4_);
    auVar289._8_4_ = -(uint)(0.0 <= auVar256._8_4_);
    auVar289._12_4_ = -(uint)(0.0 <= auVar256._12_4_);
    uVar71 = 0;
    iVar62 = movmskps((int)uVar66,auVar289);
    if (iVar62 == 0) {
      iVar62 = 0;
      auVar146 = _DAT_01feb9f0;
      auVar229 = _DAT_01feba00;
    }
    else {
      auVar164 = sqrtps(_local_4f8,auVar256);
      bVar22 = 0.0 <= auVar256._0_4_;
      uVar79 = -(uint)bVar22;
      bVar77 = 0.0 <= auVar256._4_4_;
      uVar80 = -(uint)bVar77;
      bVar23 = 0.0 <= auVar256._8_4_;
      uVar81 = -(uint)bVar23;
      bVar24 = 0.0 <= auVar256._12_4_;
      uVar84 = -(uint)bVar24;
      auVar145._0_4_ = fVar247 + fVar247;
      auVar145._4_4_ = fVar259 + fVar259;
      auVar145._8_4_ = fVar269 + fVar269;
      auVar145._12_4_ = fVar310 + fVar310;
      auVar85 = rcpps(auVar227,auVar145);
      fVar127 = auVar85._0_4_;
      fVar301 = auVar85._4_4_;
      fVar309 = auVar85._8_4_;
      fVar334 = auVar85._12_4_;
      fVar127 = (1.0 - auVar145._0_4_ * fVar127) * fVar127 + fVar127;
      fVar301 = (1.0 - auVar145._4_4_ * fVar301) * fVar301 + fVar301;
      fVar309 = (1.0 - auVar145._8_4_ * fVar309) * fVar309 + fVar309;
      fVar334 = (1.0 - auVar145._12_4_ * fVar334) * fVar334 + fVar334;
      fVar298 = (-(float)local_4f8._0_4_ - auVar164._0_4_) * fVar127;
      fVar308 = (-(float)local_4f8._4_4_ - auVar164._4_4_) * fVar301;
      fVar233 = (-fStack_4f0 - auVar164._8_4_) * fVar309;
      fVar234 = (-fStack_4ec - auVar164._12_4_) * fVar334;
      fVar127 = (auVar164._0_4_ - (float)local_4f8._0_4_) * fVar127;
      fVar301 = (auVar164._4_4_ - (float)local_4f8._4_4_) * fVar301;
      fVar309 = (auVar164._8_4_ - fStack_4f0) * fVar309;
      fVar334 = (auVar164._12_4_ - fStack_4ec) * fVar334;
      local_358._4_4_ = (fVar343 * fVar308 + fVar328) * fVar207;
      local_358._0_4_ = (fVar341 * fVar298 + fVar324) * fVar206;
      fStack_350 = (fVar345 * fVar233 + fVar302) * fVar209;
      fStack_34c = (fVar347 * fVar234 + fVar339) * fVar232;
      local_368[0] = (fVar341 * fVar127 + fVar324) * fVar206;
      local_368[1] = (fVar343 * fVar301 + fVar328) * fVar207;
      local_368[2] = (fVar345 * fVar309 + fVar302) * fVar209;
      local_368[3] = (fVar347 * fVar334 + fVar339) * fVar232;
      auVar228._0_4_ = (uint)fVar298 & uVar79;
      auVar228._4_4_ = (uint)fVar308 & uVar80;
      auVar228._8_4_ = (uint)fVar233 & uVar81;
      auVar228._12_4_ = (uint)fVar234 & uVar84;
      auVar146._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x7f8000007f800000;
      auVar146._8_4_ = ~uVar81 & 0x7f800000;
      auVar146._12_4_ = ~uVar84 & 0x7f800000;
      auVar146 = auVar146 | auVar228;
      auVar262._0_4_ = (uint)fVar127 & uVar79;
      auVar262._4_4_ = (uint)fVar301 & uVar80;
      auVar262._8_4_ = (uint)fVar309 & uVar81;
      auVar262._12_4_ = (uint)fVar334 & uVar84;
      auVar229._0_8_ = CONCAT44(~uVar80,~uVar79) & 0xff800000ff800000;
      auVar229._8_4_ = ~uVar81 & 0xff800000;
      auVar229._12_4_ = ~uVar84 & 0xff800000;
      auVar229 = auVar229 | auVar262;
      auVar263._0_8_ = CONCAT44(local_4b8._4_4_,local_4b8._0_4_) & 0x7fffffff7fffffff;
      auVar263._8_4_ = ABS(fStack_4b0);
      auVar263._12_4_ = ABS(fStack_4ac);
      auVar37._4_4_ = fStack_314;
      auVar37._0_4_ = local_318;
      auVar37._8_4_ = fStack_310;
      auVar37._12_4_ = fStack_30c;
      auVar85 = maxps(auVar37,auVar263);
      fVar127 = auVar85._0_4_ * 1.9073486e-06;
      fVar298 = auVar85._4_4_ * 1.9073486e-06;
      fVar301 = auVar85._8_4_ * 1.9073486e-06;
      fVar308 = auVar85._12_4_ * 1.9073486e-06;
      auVar264._0_4_ = -(uint)(ABS(fVar247) < fVar127 && bVar22);
      auVar264._4_4_ = -(uint)(ABS(fVar259) < fVar298 && bVar77);
      auVar264._8_4_ = -(uint)(ABS(fVar269) < fVar301 && bVar23);
      auVar264._12_4_ = -(uint)(ABS(fVar310) < fVar308 && bVar24);
      iVar62 = movmskps(iVar62,auVar264);
      if (iVar62 != 0) {
        uVar79 = -(uint)(auVar227._0_4_ <= 0.0);
        uVar80 = -(uint)(auVar227._4_4_ <= 0.0);
        uVar81 = -(uint)(auVar227._8_4_ <= 0.0);
        uVar84 = -(uint)(auVar227._12_4_ <= 0.0);
        auVar327._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar264._0_4_;
        auVar327._4_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar264._4_4_;
        auVar327._8_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar264._8_4_;
        auVar327._12_4_ = (uVar84 & 0xff800000 | ~uVar84 & 0x7f800000) & auVar264._12_4_;
        auVar204._0_4_ = ~auVar264._0_4_ & auVar146._0_4_;
        auVar204._4_4_ = ~auVar264._4_4_ & auVar146._4_4_;
        auVar204._8_4_ = ~auVar264._8_4_ & auVar146._8_4_;
        auVar204._12_4_ = ~auVar264._12_4_ & auVar146._12_4_;
        auVar146 = auVar204 | auVar327;
        auVar205._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar264._0_4_;
        auVar205._4_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar264._4_4_;
        auVar205._8_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar264._8_4_;
        auVar205._12_4_ = (uVar84 & 0x7f800000 | ~uVar84 & 0xff800000) & auVar264._12_4_;
        auVar266._0_4_ = ~auVar264._0_4_ & auVar229._0_4_;
        auVar266._4_4_ = ~auVar264._4_4_ & auVar229._4_4_;
        auVar266._8_4_ = ~auVar264._8_4_ & auVar229._8_4_;
        auVar266._12_4_ = ~auVar264._12_4_ & auVar229._12_4_;
        auVar229 = auVar266 | auVar205;
        auVar289._0_4_ = -(uint)((fVar127 <= ABS(fVar247) || auVar227._0_4_ <= 0.0) && bVar22);
        auVar289._4_4_ = -(uint)((fVar298 <= ABS(fVar259) || auVar227._4_4_ <= 0.0) && bVar77);
        auVar289._8_4_ = -(uint)((fVar301 <= ABS(fVar269) || auVar227._8_4_ <= 0.0) && bVar23);
        auVar289._12_4_ = -(uint)((fVar308 <= ABS(fVar310) || auVar227._12_4_ <= 0.0) && bVar24);
      }
    }
    auVar290._0_4_ = (auVar289._0_4_ << 0x1f) >> 0x1f;
    auVar290._4_4_ = (auVar289._4_4_ << 0x1f) >> 0x1f;
    auVar290._8_4_ = (auVar289._8_4_ << 0x1f) >> 0x1f;
    auVar290._12_4_ = (auVar289._12_4_ << 0x1f) >> 0x1f;
    auVar290 = auVar290 & local_208;
    iVar62 = movmskps(iVar62,auVar290);
    fVar125 = local_498;
    fVar127 = fStack_494;
    uVar63 = uStack_490;
    uVar208 = uStack_48c;
    if (iVar62 != 0) {
      local_398 = fVar341;
      fStack_394 = fVar343;
      fStack_390 = fVar345;
      fStack_38c = fVar347;
      local_3e8._4_4_ = fVar259;
      local_3e8._0_4_ = fVar247;
      fStack_3e0 = fVar269;
      fStack_3dc = fVar310;
      local_388._4_4_ = fVar207;
      local_388._0_4_ = fVar206;
      fStack_380 = fVar209;
      fStack_37c = fVar232;
      auVar197._0_4_ = *(float *)(ray + k * 4 + 0x80) - (float)local_378._0_4_;
      auVar197._4_4_ = auVar197._0_4_;
      auVar197._8_4_ = auVar197._0_4_;
      auVar197._12_4_ = auVar197._0_4_;
      auVar164 = minps(auVar197,auVar229);
      auVar39._4_4_ = fStack_1f4;
      auVar39._0_4_ = local_1f8;
      auVar39._8_4_ = fStack_1f0;
      auVar39._12_4_ = fStack_1ec;
      auVar274 = maxps(auVar39,auVar146);
      auVar105._0_4_ = fVar130 * fVar284 + fVar267 * fVar245;
      auVar105._4_4_ = fVar160 * fVar297 + fVar268 * local_408;
      auVar105._8_4_ = fVar162 * fVar299 + fVar283 * fStack_404;
      auVar105._12_4_ = fVar195 * fVar300 + fVar296 * fStack_400;
      auVar275._0_4_ = fVar330 * local_488 + fVar284 * local_4e8 + fVar245 * fVar83;
      auVar275._4_4_ = fVar332 * fStack_484 + fVar297 * fStack_4e4 + local_408 * fVar83;
      auVar275._8_4_ = fVar281 * fStack_480 + fVar299 * fStack_4e0 + fStack_404 * fVar83;
      auVar275._12_4_ = fVar282 * fStack_47c + fVar300 * fStack_4dc + fStack_400 * fVar83;
      auVar85 = rcpps(auVar105,auVar275);
      fVar130 = auVar85._0_4_;
      fVar160 = auVar85._4_4_;
      fVar162 = auVar85._8_4_;
      fVar195 = auVar85._12_4_;
      fVar130 = ((1.0 - auVar275._0_4_ * fVar130) * fVar130 + fVar130) *
                -(fVar311 * fVar330 + auVar105._0_4_);
      fVar160 = ((1.0 - auVar275._4_4_ * fVar160) * fVar160 + fVar160) *
                -(fVar320 * fVar332 + auVar105._4_4_);
      fVar162 = ((1.0 - auVar275._8_4_ * fVar162) * fVar162 + fVar162) *
                -(fVar321 * fVar281 + auVar105._8_4_);
      fVar195 = ((1.0 - auVar275._12_4_ * fVar195) * fVar195 + fVar195) *
                -(fVar322 * fVar282 + auVar105._12_4_);
      auVar237._0_12_ = ZEXT812(0);
      auVar237._12_4_ = 0;
      uVar79 = -(uint)(auVar275._0_4_ < 0.0 || ABS(auVar275._0_4_) < 1e-18);
      uVar80 = -(uint)(auVar275._4_4_ < 0.0 || ABS(auVar275._4_4_) < 1e-18);
      uVar81 = -(uint)(auVar275._8_4_ < 0.0 || ABS(auVar275._8_4_) < 1e-18);
      uVar84 = -(uint)(auVar275._12_4_ < 0.0 || ABS(auVar275._12_4_) < 1e-18);
      auVar230._0_8_ = CONCAT44(uVar80,uVar79) & 0xff800000ff800000;
      auVar230._8_4_ = uVar81 & 0xff800000;
      auVar230._12_4_ = uVar84 & 0xff800000;
      auVar106._0_4_ = ~uVar79 & (uint)fVar130;
      auVar106._4_4_ = ~uVar80 & (uint)fVar160;
      auVar106._8_4_ = ~uVar81 & (uint)fVar162;
      auVar106._12_4_ = ~uVar84 & (uint)fVar195;
      auVar274 = maxps(auVar274,auVar106 | auVar230);
      uVar79 = -(uint)(0.0 < auVar275._0_4_ || ABS(auVar275._0_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar275._4_4_ || ABS(auVar275._4_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar275._8_4_ || ABS(auVar275._8_4_) < 1e-18);
      uVar84 = -(uint)(0.0 < auVar275._12_4_ || ABS(auVar275._12_4_) < 1e-18);
      auVar107._0_8_ = CONCAT44(uVar80,uVar79) & 0x7f8000007f800000;
      auVar107._8_4_ = uVar81 & 0x7f800000;
      auVar107._12_4_ = uVar84 & 0x7f800000;
      auVar276._0_4_ = ~uVar79 & (uint)fVar130;
      auVar276._4_4_ = ~uVar80 & (uint)fVar160;
      auVar276._8_4_ = ~uVar81 & (uint)fVar162;
      auVar276._12_4_ = ~uVar84 & (uint)fVar195;
      auVar164 = minps(auVar164,auVar276 | auVar107);
      auVar147._0_4_ = (0.0 - fVar336) * -fVar297 + (0.0 - fVar342) * -local_408;
      auVar147._4_4_ = (0.0 - fVar337) * -fVar299 + (0.0 - fVar344) * -fStack_404;
      auVar147._8_4_ = (0.0 - fVar338) * -fVar300 + (0.0 - fVar346) * -fStack_400;
      auVar147._12_4_ = 0x80000000;
      auVar166._0_4_ = -fVar332 * local_488 + -fVar297 * local_4e8 + -local_408 * fVar83;
      auVar166._4_4_ = -fVar281 * fStack_484 + -fVar299 * fStack_4e4 + -fStack_404 * fVar83;
      auVar166._8_4_ = -fVar282 * fStack_480 + -fVar300 * fStack_4e0 + -fStack_400 * fVar83;
      auVar166._12_4_ = fStack_47c * -0.0 + fStack_4dc * -0.0 + fVar83 * -0.0;
      auVar85 = rcpps(auVar147,auVar166);
      fVar130 = auVar85._0_4_;
      fVar160 = auVar85._4_4_;
      fVar162 = auVar85._8_4_;
      fVar195 = auVar85._12_4_;
      fVar130 = ((fVar231 - auVar166._0_4_ * fVar130) * fVar130 + fVar130) *
                -((0.0 - fVar329) * -fVar332 + auVar147._0_4_);
      fVar160 = ((fVar235 - auVar166._4_4_ * fVar160) * fVar160 + fVar160) *
                -((0.0 - fVar331) * -fVar281 + auVar147._4_4_);
      fVar162 = ((fVar246 - auVar166._8_4_ * fVar162) * fVar162 + fVar162) *
                -((0.0 - fVar333) * -fVar282 + auVar147._8_4_);
      fVar195 = ((fVar258 - auVar166._12_4_ * fVar195) * fVar195 + fVar195) * 0.0;
      uVar79 = -(uint)(auVar166._0_4_ < 0.0 || ABS(auVar166._0_4_) < 1e-18);
      uVar80 = -(uint)(auVar166._4_4_ < 0.0 || ABS(auVar166._4_4_) < 1e-18);
      uVar81 = -(uint)(auVar166._8_4_ < 0.0 || ABS(auVar166._8_4_) < 1e-18);
      uVar84 = -(uint)(auVar166._12_4_ < 0.0 || ABS(auVar166._12_4_) < 1e-18);
      auVar148._0_8_ = CONCAT44(uVar80,uVar79) & 0xff800000ff800000;
      auVar148._8_4_ = uVar81 & 0xff800000;
      auVar148._12_4_ = uVar84 & 0xff800000;
      auVar108._0_4_ = ~uVar79 & (uint)fVar130;
      auVar108._4_4_ = ~uVar80 & (uint)fVar160;
      auVar108._8_4_ = ~uVar81 & (uint)fVar162;
      auVar108._12_4_ = ~uVar84 & (uint)fVar195;
      auVar274 = maxps(auVar274,auVar108 | auVar148);
      uVar79 = -(uint)(0.0 < auVar166._0_4_ || ABS(auVar166._0_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar166._4_4_ || ABS(auVar166._4_4_) < 1e-18);
      uVar81 = -(uint)(0.0 < auVar166._8_4_ || ABS(auVar166._8_4_) < 1e-18);
      uVar84 = -(uint)(0.0 < auVar166._12_4_ || ABS(auVar166._12_4_) < 1e-18);
      auVar109._0_8_ = CONCAT44(uVar80,uVar79) & 0x7f8000007f800000;
      auVar109._8_4_ = uVar81 & 0x7f800000;
      auVar109._12_4_ = uVar84 & 0x7f800000;
      auVar167._0_4_ = ~uVar79 & (uint)fVar130;
      auVar167._4_4_ = ~uVar80 & (uint)fVar160;
      auVar167._8_4_ = ~uVar81 & (uint)fVar162;
      auVar167._12_4_ = ~uVar84 & (uint)fVar195;
      auVar85 = minps(auVar164,auVar167 | auVar109);
      fVar130 = auVar274._12_4_;
      fVar160 = auVar274._0_4_;
      fVar162 = auVar274._4_4_;
      fVar195 = auVar274._8_4_;
      auVar317._0_4_ = -(uint)(fVar160 <= auVar85._0_4_) & auVar290._0_4_;
      auVar317._4_4_ = -(uint)(fVar162 <= auVar85._4_4_) & auVar290._4_4_;
      auVar317._8_4_ = -(uint)(fVar195 <= auVar85._8_4_) & auVar290._8_4_;
      auVar317._12_4_ = -(uint)(fVar130 <= auVar85._12_4_) & auVar290._12_4_;
      iVar62 = movmskps(iVar62,auVar317);
      if (iVar62 != 0) {
        auVar164 = maxps(ZEXT816(0),_local_448);
        auVar255 = minps(_local_358,_DAT_01feca10);
        auVar255 = maxps(auVar255,auVar237);
        auVar36._4_4_ = local_368[1];
        auVar36._0_4_ = local_368[0];
        auVar36._8_4_ = local_368[2];
        auVar36._12_4_ = local_368[3];
        auVar168 = minps(auVar36,_DAT_01feca10);
        auVar168 = maxps(auVar168,auVar237);
        local_358._0_4_ = (auVar255._0_4_ + 0.0) * 0.25 * local_418 + fVar125;
        local_358._4_4_ = (auVar255._4_4_ + 1.0) * 0.25 * local_418 + fVar125;
        fStack_350 = (auVar255._8_4_ + 2.0) * 0.25 * local_418 + fVar125;
        fStack_34c = (auVar255._12_4_ + 3.0) * 0.25 * local_418 + fVar125;
        local_368[0] = (auVar168._0_4_ + 0.0) * 0.25 * local_418 + fVar125;
        local_368[1] = (auVar168._4_4_ + 1.0) * 0.25 * local_418 + fVar125;
        local_368[2] = (auVar168._8_4_ + 2.0) * 0.25 * local_418 + fVar125;
        local_368[3] = (auVar168._12_4_ + 3.0) * 0.25 * local_418 + fVar125;
        fVar279 = fVar279 - auVar164._0_4_ * auVar164._0_4_;
        fVar280 = fVar280 - auVar164._4_4_ * auVar164._4_4_;
        fVar323 = fVar323 - auVar164._8_4_ * auVar164._8_4_;
        fVar260 = fVar260 - auVar164._12_4_ * auVar164._12_4_;
        auVar257._0_4_ = local_438 - fVar247 * 4.0 * fVar279;
        auVar257._4_4_ = fStack_434 - fVar259 * 4.0 * fVar280;
        auVar257._8_4_ = fStack_430 - fVar269 * 4.0 * fVar323;
        auVar257._12_4_ = fStack_42c - fVar310 * 4.0 * fVar260;
        local_578._4_4_ = -(uint)(0.0 <= auVar257._4_4_);
        local_578._0_4_ = -(uint)(0.0 <= auVar257._0_4_);
        local_578._8_4_ = -(uint)(0.0 <= auVar257._8_4_);
        local_578._12_4_ = -(uint)(0.0 <= auVar257._12_4_);
        iVar62 = movmskps(iVar62,local_578);
        if (iVar62 == 0) {
          fVar309 = 0.0;
          fVar311 = 0.0;
          fVar320 = 0.0;
          fVar321 = 0.0;
          fVar296 = 0.0;
          fVar298 = 0.0;
          fVar301 = 0.0;
          fVar308 = 0.0;
          fVar125 = 0.0;
          fVar206 = 0.0;
          fVar207 = 0.0;
          fVar209 = 0.0;
          fVar231 = 0.0;
          fVar235 = 0.0;
          fVar245 = 0.0;
          fVar246 = 0.0;
          fVar258 = 0.0;
          fVar267 = 0.0;
          fVar268 = 0.0;
          fVar283 = 0.0;
          _local_4f8 = ZEXT816(0);
          iVar62 = 0;
          auVar149 = _DAT_01feba00;
          auVar265 = _DAT_01feb9f0;
        }
        else {
          auVar255 = sqrtps(auVar237,auVar257);
          auVar110._0_4_ = fVar247 + fVar247;
          auVar110._4_4_ = fVar259 + fVar259;
          auVar110._8_4_ = fVar269 + fVar269;
          auVar110._12_4_ = fVar310 + fVar310;
          auVar164 = rcpps(_local_358,auVar110);
          fVar322 = auVar164._0_4_;
          fVar330 = auVar164._4_4_;
          fVar332 = auVar164._8_4_;
          fVar281 = auVar164._12_4_;
          fVar322 = (fVar231 - auVar110._0_4_ * fVar322) * fVar322 + fVar322;
          fVar330 = (fVar235 - auVar110._4_4_ * fVar330) * fVar330 + fVar330;
          fVar332 = (fVar246 - auVar110._8_4_ * fVar332) * fVar332 + fVar332;
          fVar281 = (fVar258 - auVar110._12_4_ * fVar281) * fVar281 + fVar281;
          fVar282 = (-(float)local_4f8._0_4_ - auVar255._0_4_) * fVar322;
          fVar284 = (-(float)local_4f8._4_4_ - auVar255._4_4_) * fVar330;
          fVar297 = (-fStack_4f0 - auVar255._8_4_) * fVar332;
          fVar299 = (-fStack_4ec - auVar255._12_4_) * fVar281;
          fVar322 = (auVar255._0_4_ - (float)local_4f8._0_4_) * fVar322;
          fVar330 = (auVar255._4_4_ - (float)local_4f8._4_4_) * fVar330;
          fVar332 = (auVar255._8_4_ - fStack_4f0) * fVar332;
          fVar281 = (auVar255._12_4_ - fStack_4ec) * fVar281;
          fVar125 = (fVar341 * fVar282 + fVar324) * fVar206;
          fVar296 = (fVar343 * fVar284 + fVar328) * fVar207;
          fVar298 = (fVar345 * fVar297 + fVar302) * fVar209;
          fVar301 = (fVar347 * fVar299 + fVar339) * fVar232;
          fVar231 = local_488 * fVar282 - ((float)local_4a8._0_4_ * fVar125 + fVar325);
          fVar235 = fStack_484 * fVar284 - ((float)local_4a8._4_4_ * fVar296 + fVar329);
          fVar245 = fStack_480 * fVar297 - (fStack_4a0 * fVar298 + fVar331);
          fVar246 = fStack_47c * fVar299 - (fStack_49c * fVar301 + fVar333);
          fVar258 = local_4e8 * fVar282 - (local_458 * fVar125 + fVar335);
          fVar267 = fStack_4e4 * fVar284 - (fStack_454 * fVar296 + fVar336);
          fVar268 = fStack_4e0 * fVar297 - (fStack_450 * fVar298 + fVar337);
          fVar283 = fStack_4dc * fVar299 - (fStack_44c * fVar301 + fVar338);
          local_4f8._4_4_ = fVar83 * fVar284 - (fVar296 * fStack_474 + fVar342);
          local_4f8._0_4_ = fVar83 * fVar282 - (fVar125 * local_478 + fVar340);
          fStack_4f0 = fVar83 * fVar297 - (fVar298 * fStack_470 + fVar344);
          fStack_4ec = fVar83 * fVar299 - (fVar301 * fStack_46c + fVar346);
          fVar206 = (fVar341 * fVar322 + fVar324) * fVar206;
          fVar207 = (fVar343 * fVar330 + fVar328) * fVar207;
          fVar209 = (fVar345 * fVar332 + fVar302) * fVar209;
          fVar232 = (fVar347 * fVar281 + fVar339) * fVar232;
          fVar309 = local_488 * fVar322 - ((float)local_4a8._0_4_ * fVar206 + fVar325);
          fVar311 = fStack_484 * fVar330 - ((float)local_4a8._4_4_ * fVar207 + fVar329);
          fVar320 = fStack_480 * fVar332 - (fStack_4a0 * fVar209 + fVar331);
          fVar321 = fStack_47c * fVar281 - (fStack_49c * fVar232 + fVar333);
          fVar296 = local_4e8 * fVar322 - (local_458 * fVar206 + fVar335);
          fVar298 = fStack_4e4 * fVar330 - (fStack_454 * fVar207 + fVar336);
          fVar301 = fStack_4e0 * fVar332 - (fStack_450 * fVar209 + fVar337);
          fVar308 = fStack_4dc * fVar281 - (fStack_44c * fVar232 + fVar338);
          bVar22 = 0.0 <= auVar257._0_4_;
          uVar79 = -(uint)bVar22;
          bVar77 = 0.0 <= auVar257._4_4_;
          uVar80 = -(uint)bVar77;
          bVar23 = 0.0 <= auVar257._8_4_;
          uVar81 = -(uint)bVar23;
          bVar24 = 0.0 <= auVar257._12_4_;
          uVar84 = -(uint)bVar24;
          fVar125 = fVar83 * fVar322 - (fVar206 * local_478 + fVar340);
          fVar206 = fVar83 * fVar330 - (fVar207 * fStack_474 + fVar342);
          fVar207 = fVar83 * fVar332 - (fVar209 * fStack_470 + fVar344);
          fVar209 = fVar83 * fVar281 - (fVar232 * fStack_46c + fVar346);
          auVar277._0_4_ = (uint)fVar282 & uVar79;
          auVar277._4_4_ = (uint)fVar284 & uVar80;
          auVar277._8_4_ = (uint)fVar297 & uVar81;
          auVar277._12_4_ = (uint)fVar299 & uVar84;
          auVar265._0_8_ = CONCAT44(~uVar80,~uVar79) & 0x7f8000007f800000;
          auVar265._8_4_ = ~uVar81 & 0x7f800000;
          auVar265._12_4_ = ~uVar84 & 0x7f800000;
          auVar265 = auVar265 | auVar277;
          auVar238._0_4_ = (uint)fVar322 & uVar79;
          auVar238._4_4_ = (uint)fVar330 & uVar80;
          auVar238._8_4_ = (uint)fVar332 & uVar81;
          auVar238._12_4_ = (uint)fVar281 & uVar84;
          auVar149._0_8_ = CONCAT44(~uVar80,~uVar79) & 0xff800000ff800000;
          auVar149._8_4_ = ~uVar81 & 0xff800000;
          auVar149._12_4_ = ~uVar84 & 0xff800000;
          auVar149 = auVar149 | auVar238;
          auVar111._0_8_ = (ulong)local_4b8 & 0x7fffffff7fffffff;
          auVar111._8_4_ = ABS(fStack_4b0);
          auVar111._12_4_ = ABS(fStack_4ac);
          auVar38._4_4_ = fStack_314;
          auVar38._0_4_ = local_318;
          auVar38._8_4_ = fStack_310;
          auVar38._12_4_ = fStack_30c;
          auVar164 = maxps(auVar38,auVar111);
          fVar232 = auVar164._0_4_ * 1.9073486e-06;
          fVar322 = auVar164._4_4_ * 1.9073486e-06;
          fVar324 = auVar164._8_4_ * 1.9073486e-06;
          fVar328 = auVar164._12_4_ * 1.9073486e-06;
          auVar239._0_4_ = -(uint)(ABS(fVar247) < fVar232 && bVar22);
          auVar239._4_4_ = -(uint)(ABS(fVar259) < fVar322 && bVar77);
          auVar239._8_4_ = -(uint)(ABS(fVar269) < fVar324 && bVar23);
          auVar239._12_4_ = -(uint)(ABS(fVar310) < fVar328 && bVar24);
          iVar62 = movmskps(iVar62,auVar239);
          if (iVar62 != 0) {
            uVar79 = -(uint)(fVar279 <= 0.0);
            uVar80 = -(uint)(fVar280 <= 0.0);
            uVar81 = -(uint)(fVar323 <= 0.0);
            uVar84 = -(uint)(fVar260 <= 0.0);
            auVar294._0_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar239._0_4_;
            auVar294._4_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar239._4_4_;
            auVar294._8_4_ = (uVar81 & 0xff800000 | ~uVar81 & 0x7f800000) & auVar239._8_4_;
            auVar294._12_4_ = (uVar84 & 0xff800000 | ~uVar84 & 0x7f800000) & auVar239._12_4_;
            auVar278._0_4_ = ~auVar239._0_4_ & auVar265._0_4_;
            auVar278._4_4_ = ~auVar239._4_4_ & auVar265._4_4_;
            auVar278._8_4_ = ~auVar239._8_4_ & auVar265._8_4_;
            auVar278._12_4_ = ~auVar239._12_4_ & auVar265._12_4_;
            auVar265 = auVar278 | auVar294;
            auVar295._0_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar239._0_4_;
            auVar295._4_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar239._4_4_;
            auVar295._8_4_ = (uVar81 & 0x7f800000 | ~uVar81 & 0xff800000) & auVar239._8_4_;
            auVar295._12_4_ = (uVar84 & 0x7f800000 | ~uVar84 & 0xff800000) & auVar239._12_4_;
            auVar244._0_4_ = ~auVar239._0_4_ & auVar149._0_4_;
            auVar244._4_4_ = ~auVar239._4_4_ & auVar149._4_4_;
            auVar244._8_4_ = ~auVar239._8_4_ & auVar149._8_4_;
            auVar244._12_4_ = ~auVar239._12_4_ & auVar149._12_4_;
            auVar149 = auVar244 | auVar295;
            local_578._4_4_ = -(uint)((fVar322 <= ABS(fVar259) || fVar280 <= 0.0) && bVar77);
            local_578._0_4_ = -(uint)((fVar232 <= ABS(fVar247) || fVar279 <= 0.0) && bVar22);
            local_578._8_4_ = -(uint)((fVar324 <= ABS(fVar269) || fVar323 <= 0.0) && bVar23);
            local_578._12_4_ = -(uint)((fVar328 <= ABS(fVar310) || fVar260 <= 0.0) && bVar24);
          }
        }
        local_4a8._4_4_ =
             -(uint)(0.3 <= ABS(fVar311 * fStack_484 + fVar298 * fStack_4e4 + fVar206 * fVar83));
        local_4a8._0_4_ =
             -(uint)(0.3 <= ABS(fVar309 * local_488 + fVar296 * local_4e8 + fVar125 * fVar83));
        fStack_4a0 = (float)-(uint)(0.3 <= ABS(fVar320 * fStack_480 +
                                               fVar301 * fStack_4e0 + fVar207 * fVar83));
        fStack_49c = (float)-(uint)(0.3 <= ABS(fVar321 * fStack_47c +
                                               fVar308 * fStack_4dc + fVar209 * fVar83));
        _local_118 = auVar274;
        local_108 = minps(auVar85,auVar265);
        _local_238 = maxps(auVar274,auVar149);
        local_228 = auVar85;
        auVar198._0_4_ = -(uint)(fVar160 <= local_108._0_4_) & auVar317._0_4_;
        auVar198._4_4_ = -(uint)(fVar162 <= local_108._4_4_) & auVar317._4_4_;
        auVar198._8_4_ = -(uint)(fVar195 <= local_108._8_4_) & auVar317._8_4_;
        auVar198._12_4_ = -(uint)(fVar130 <= local_108._12_4_) & auVar317._12_4_;
        local_3a8 = auVar198;
        _local_4b8 = _local_238;
        local_3b8._0_4_ = -(uint)(local_238._0_4_ <= auVar85._0_4_) & auVar317._0_4_;
        local_3b8._4_4_ = -(uint)(local_238._4_4_ <= auVar85._4_4_) & auVar317._4_4_;
        local_3b8._8_4_ = -(uint)(local_238._8_4_ <= auVar85._8_4_) & auVar317._8_4_;
        local_3b8._12_4_ = -(uint)(local_238._12_4_ <= auVar85._12_4_) & auVar317._12_4_;
        _local_3e8 = local_3b8;
        iVar62 = movmskps(iVar62,local_3b8 | auVar198);
        fVar125 = local_498;
        if (iVar62 != 0) {
          local_398 = (float)local_530;
          fStack_394 = (float)local_530;
          fStack_390 = (float)local_530;
          fStack_38c = (float)local_530;
          local_4f8._0_4_ =
               -(uint)((int)(float)local_530 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4f8._0_4_ * fVar83 +
                                                 fVar258 * local_4e8 + fVar231 * local_488)) &
                             local_578._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4f8._4_4_ =
               -(uint)((int)(float)local_530 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4f8._4_4_ * fVar83 +
                                                 fVar267 * fStack_4e4 + fVar235 * fStack_484)) &
                             local_578._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4f0 = (float)-(uint)((int)(float)local_530 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4f0 * fVar83 +
                                                                fVar268 * fStack_4e0 +
                                                                fVar245 * fStack_480)) &
                                            local_578._8_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4ec = (float)-(uint)((int)(float)local_530 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4ec * fVar83 +
                                                                fVar283 * fStack_4dc +
                                                                fVar246 * fStack_47c)) &
                                            local_578._12_4_) << 0x1f) >> 0x1f) + 4);
          local_3a8 = ~_local_4f8 & auVar198;
          iVar62 = movmskps(iVar62,local_3a8);
          _local_388 = auVar198;
          auVar292 = auVar274;
          if (iVar62 != 0) {
            local_478 = local_468 + fVar160;
            fStack_474 = fStack_464 + fVar162;
            fStack_470 = fStack_460 + fVar195;
            fStack_46c = fStack_45c + fVar130;
            do {
              auVar164 = ~local_3a8 & _DAT_01feb9f0 | local_3a8 & auVar274;
              auVar186._4_4_ = auVar164._0_4_;
              auVar186._0_4_ = auVar164._4_4_;
              auVar186._8_4_ = auVar164._12_4_;
              auVar186._12_4_ = auVar164._8_4_;
              auVar85 = minps(auVar186,auVar164);
              auVar150._0_8_ = auVar85._8_8_;
              auVar150._8_4_ = auVar85._0_4_;
              auVar150._12_4_ = auVar85._4_4_;
              auVar85 = minps(auVar150,auVar85);
              auVar151._0_8_ =
                   CONCAT44(-(uint)(auVar85._4_4_ == auVar164._4_4_) & local_3a8._4_4_,
                            -(uint)(auVar85._0_4_ == auVar164._0_4_) & local_3a8._0_4_);
              auVar151._8_4_ = -(uint)(auVar85._8_4_ == auVar164._8_4_) & local_3a8._8_4_;
              auVar151._12_4_ = -(uint)(auVar85._12_4_ == auVar164._12_4_) & local_3a8._12_4_;
              iVar62 = movmskps(iVar62,auVar151);
              auVar112 = local_3a8;
              if (iVar62 != 0) {
                auVar112._8_4_ = auVar151._8_4_;
                auVar112._0_8_ = auVar151._0_8_;
                auVar112._12_4_ = auVar151._12_4_;
              }
              uVar63 = movmskps(iVar62,auVar112);
              uVar66 = 0;
              if (CONCAT44(uVar71,uVar63) != 0) {
                for (; (CONCAT44(uVar71,uVar63) >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
                }
              }
              *(undefined4 *)(local_3a8 + uVar66 * 4) = 0;
              fVar125 = *(float *)(local_358 + uVar66 * 4);
              fVar127 = *(float *)(local_118 + uVar66 * 4);
              fVar130 = SQRT(fVar161);
              if ((float)local_3d8._0_4_ < 0.0) {
                fVar130 = sqrtf((float)local_3d8._0_4_);
                uVar66 = extraout_RAX;
              }
              auVar30._4_4_ = fVar179;
              auVar30._0_4_ = fVar177;
              auVar30._8_4_ = fVar193;
              auVar30._12_4_ = fVar194;
              auVar34._4_4_ = fStack_4c4;
              auVar34._0_4_ = local_4c8;
              auVar34._8_4_ = fStack_4c0;
              auVar34._12_4_ = fStack_4bc;
              auVar164 = minps(auVar30,auVar34);
              auVar255 = maxps(auVar30,auVar34);
              auVar32._4_4_ = fStack_4d4;
              auVar32._0_4_ = local_4d8;
              auVar32._8_4_ = fStack_4d0;
              auVar32._12_4_ = fStack_4cc;
              auVar85 = minps(auVar32,_local_608);
              auVar164 = minps(auVar164,auVar85);
              auVar85 = maxps(auVar32,_local_608);
              auVar85 = maxps(auVar255,auVar85);
              auVar199._0_8_ = auVar164._0_8_ & 0x7fffffff7fffffff;
              auVar199._8_4_ = auVar164._8_4_ & 0x7fffffff;
              auVar199._12_4_ = auVar164._12_4_ & 0x7fffffff;
              local_458 = auVar85._12_4_;
              auVar113._0_8_ = auVar85._0_8_ & 0x7fffffff7fffffff;
              auVar113._8_4_ = auVar85._8_4_ & 0x7fffffff;
              auVar113._12_4_ = ABS(local_458);
              auVar85 = maxps(auVar199,auVar113);
              fVar160 = auVar85._4_4_;
              if (auVar85._4_4_ <= auVar85._0_4_) {
                fVar160 = auVar85._0_4_;
              }
              auVar200._8_8_ = auVar85._8_8_;
              auVar200._0_8_ = auVar85._8_8_;
              if (auVar85._8_4_ <= fVar160) {
                auVar200._0_4_ = fVar160;
              }
              fVar160 = auVar200._0_4_ * 1.9073486e-06;
              local_408 = fVar130 * 1.9073486e-06;
              fStack_454 = local_458;
              fStack_450 = local_458;
              fStack_44c = local_458;
              lVar75 = 4;
              do {
                auVar291._4_12_ = auVar292._4_12_;
                fVar258 = 1.0 - fVar125;
                fVar207 = local_4c8 * fVar258 + local_4d8 * fVar125;
                fVar209 = fStack_4c4 * fVar258 + fStack_4d4 * fVar125;
                fVar231 = fStack_4c0 * fVar258 + fStack_4d0 * fVar125;
                fVar235 = fStack_4bc * fVar258 + fStack_4cc * fVar125;
                fVar130 = (fVar177 * fVar258 + local_4c8 * fVar125) * fVar258 + fVar125 * fVar207;
                fVar162 = (fVar179 * fVar258 + fStack_4c4 * fVar125) * fVar258 + fVar125 * fVar209;
                fVar195 = (fVar193 * fVar258 + fStack_4c0 * fVar125) * fVar258 + fVar125 * fVar231;
                fVar206 = (fVar194 * fVar258 + fStack_4bc * fVar125) * fVar258 + fVar125 * fVar235;
                fVar207 = fVar207 * fVar258 +
                          (local_4d8 * fVar258 + (float)local_608._0_4_ * fVar125) * fVar125;
                fVar232 = fVar209 * fVar258 +
                          (fStack_4d4 * fVar258 + (float)local_608._4_4_ * fVar125) * fVar125;
                fVar245 = fVar231 * fVar258 +
                          (fStack_4d0 * fVar258 + fStack_600 * fVar125) * fVar125;
                fVar247 = fVar235 * fVar258 +
                          (fStack_4cc * fVar258 + fStack_5fc * fVar125) * fVar125;
                fVar209 = fVar258 * fVar206 + fVar125 * fVar247;
                fVar231 = (fVar207 - fVar130) * 3.0;
                fVar235 = (fVar232 - fVar162) * 3.0;
                fVar246 = (fVar245 - fVar195) * 3.0;
                fVar247 = (fVar247 - fVar206) * 3.0;
                fVar206 = (fVar127 * (float)local_3c8._0_4_ + 0.0) -
                          (fVar258 * fVar130 + fVar125 * fVar207);
                fVar207 = (fVar127 * (float)local_3c8._4_4_ + 0.0) -
                          (fVar258 * fVar162 + fVar125 * fVar232);
                fVar195 = (fVar127 * fStack_3c0 + 0.0) - (fVar258 * fVar195 + fVar125 * fVar245);
                fVar162 = (fVar127 * fStack_3bc + 0.0) - fVar209;
                fVar130 = fVar207 * fVar207;
                fStack_610 = fVar195 * fVar195;
                fStack_60c = fVar162 * fVar162;
                local_618._0_4_ = fVar130 + fVar206 * fVar206 + fStack_610;
                local_618._4_4_ = fVar130 + fVar130 + fStack_60c;
                fStack_610 = fVar130 + fStack_610 + fStack_610;
                fStack_60c = fVar130 + fStack_60c + fStack_60c;
                local_418 = (float)local_618._0_4_;
                if ((float)local_618._0_4_ < 0.0) {
                  fVar130 = sqrtf((float)local_618._0_4_);
                  auVar291._4_4_ = extraout_var._0_4_;
                  auVar291._0_4_ = fVar130;
                  auVar291._8_4_ = extraout_var._4_4_;
                  auVar291._12_4_ = extraout_var._8_4_;
                  uVar65 = extraout_RAX_00;
                }
                else {
                  auVar291._0_4_ = SQRT((float)local_618._0_4_);
                  uVar65 = uVar66;
                }
                fVar259 = fVar258 * 6.0;
                fVar130 = (fVar125 - (fVar258 + fVar258)) * 6.0;
                fVar245 = (fVar258 - (fVar125 + fVar125)) * 6.0;
                fVar232 = fVar125 * 6.0;
                fVar258 = fVar259 * fVar177 +
                          fVar130 * local_4c8 +
                          fVar245 * local_4d8 + fVar232 * (float)local_608._0_4_;
                fVar269 = fVar259 * fVar179 +
                          fVar130 * fStack_4c4 +
                          fVar245 * fStack_4d4 + fVar232 * (float)local_608._4_4_;
                fVar232 = fVar259 * fVar193 +
                          fVar130 * fStack_4c0 + fVar245 * fStack_4d0 + fVar232 * fStack_600;
                fVar130 = fVar160;
                if (fVar160 <= local_408 * fVar127) {
                  fVar130 = local_408 * fVar127;
                }
                fVar245 = fVar235 * fVar235 + fVar231 * fVar231 + fVar246 * fVar246;
                auVar164 = ZEXT416((uint)fVar245);
                auVar85 = rsqrtss(ZEXT416((uint)fVar245),auVar164);
                fVar259 = auVar85._0_4_;
                fVar259 = fVar259 * fVar259 * fVar245 * -0.5 * fVar259 + fVar259 * 1.5;
                fVar279 = fVar246 * fVar232 + fVar235 * fVar269 + fVar231 * fVar258;
                auVar85 = rcpss(auVar164,auVar164);
                fVar280 = (2.0 - fVar245 * auVar85._0_4_) * auVar85._0_4_;
                fVar323 = fVar231 * fVar259;
                fVar260 = fVar235 * fVar259;
                fVar267 = fVar246 * fVar259;
                fVar268 = fVar247 * fVar259;
                if (fVar245 < 0.0) {
                  fVar283 = sqrtf(fVar245);
                  auVar291 = ZEXT416(auVar291._0_4_);
                  uVar65 = extraout_RAX_01;
                }
                else {
                  fVar283 = SQRT(fVar245);
                }
                fVar296 = fVar207 * fVar260;
                fVar298 = fVar195 * fVar267;
                fVar301 = fVar162 * fVar268;
                fVar308 = fVar296 + fVar206 * fVar323 + fVar298;
                fVar309 = fVar296 + fVar296 + fVar301;
                fVar298 = fVar296 + fVar298 + fVar298;
                fVar301 = fVar296 + fVar301 + fVar301;
                auVar292._0_4_ =
                     (auVar291._0_4_ + 1.0) * (fVar160 / fVar283) +
                     auVar291._0_4_ * fVar160 + fVar130;
                auVar292._4_12_ = auVar291._4_12_;
                fVar283 = fStack_3bc * fVar268;
                fVar280 = fVar267 * -fVar246 + fVar260 * -fVar235 + fVar323 * -fVar231 +
                          fVar280 * (fVar245 * fVar232 - fVar279 * fVar246) * fVar259 * fVar195 +
                          fVar280 * (fVar245 * fVar269 - fVar279 * fVar235) * fVar259 * fVar207 +
                          fVar280 * (fVar245 * fVar258 - fVar279 * fVar231) * fVar259 * fVar206;
                fVar232 = fStack_3c0 * fVar267 +
                          (float)local_3c8._4_4_ * fVar260 + (float)local_3c8._0_4_ * fVar323;
                fVar245 = (float)local_618._0_4_ - fVar308 * fVar308;
                auVar114._0_8_ = CONCAT44((float)local_618._4_4_ - fVar309 * fVar309,fVar245);
                auVar114._8_4_ = fStack_610 - fVar298 * fVar298;
                auVar114._12_4_ = fStack_60c - fVar301 * fVar301;
                fVar279 = -fVar247 * fVar162;
                fVar259 = fStack_3c0 * fVar195;
                fVar162 = fStack_3bc * fVar162;
                fVar258 = (fVar259 +
                          (float)local_3c8._4_4_ * fVar207 + (float)local_3c8._0_4_ * fVar206) -
                          fVar308 * fVar232;
                auVar187._8_4_ = auVar114._8_4_;
                auVar187._0_8_ = auVar114._0_8_;
                auVar187._12_4_ = auVar114._12_4_;
                auVar85 = rsqrtss(auVar187,auVar114);
                fVar269 = auVar85._0_4_;
                auVar188._4_12_ = auVar85._4_12_;
                auVar188._0_4_ = fVar269 * fVar269 * fVar245 * -0.5 * fVar269 + fVar269 * 1.5;
                if (fVar245 < 0.0) {
                  _local_448 = auVar188;
                  local_438 = fVar232;
                  fStack_434 = fVar283;
                  fStack_430 = fStack_3c0 * fVar267;
                  fStack_42c = fVar283;
                  local_428 = fVar308;
                  fStack_424 = fVar309;
                  fStack_420 = fVar298;
                  fStack_41c = fVar301;
                  fVar245 = sqrtf(fVar245);
                  auVar292 = ZEXT416((uint)auVar292._0_4_);
                  uVar65 = extraout_RAX_02;
                  auVar188 = _local_448;
                  fVar269 = local_428;
                  fVar232 = local_438;
                  fVar283 = fStack_434;
                }
                else {
                  fVar245 = SQRT(fVar245);
                  fVar269 = fVar308;
                }
                fVar245 = fVar245 - fVar209;
                fVar209 = ((-fVar246 * fVar195 + -fVar235 * fVar207 + -fVar231 * fVar206) -
                          fVar308 * fVar280) * auVar188._0_4_ - fVar247;
                auVar28._4_4_ = fVar162;
                auVar28._0_4_ = fVar258;
                auVar28._8_4_ = fVar259;
                auVar28._12_4_ = fVar162;
                auVar169._4_12_ = auVar28._4_12_;
                auVar169._0_4_ = fVar258 * auVar188._0_4_;
                auVar241._0_8_ = CONCAT44(fVar279,fVar209) ^ 0x8000000080000000;
                auVar241._8_4_ = -fVar279;
                auVar241._12_4_ = fVar268 * -fVar247;
                auVar240._8_8_ = auVar241._8_8_;
                auVar240._0_8_ = CONCAT44(fVar280,fVar209) ^ 0x80000000;
                auVar318._0_4_ = fVar280 * auVar169._0_4_ - fVar232 * fVar209;
                auVar171._0_8_ = auVar169._0_8_;
                auVar171._8_4_ = fVar162;
                auVar171._12_4_ = -fVar283;
                auVar170._8_8_ = auVar171._8_8_;
                auVar170._0_8_ = CONCAT44(fVar232,auVar169._0_4_) ^ 0x8000000000000000;
                auVar318._4_4_ = auVar318._0_4_;
                auVar318._8_4_ = auVar318._0_4_;
                auVar318._12_4_ = auVar318._0_4_;
                auVar85 = divps(auVar170,auVar318);
                auVar164 = divps(auVar240,auVar318);
                fVar125 = fVar125 - (auVar85._4_4_ * fVar245 + auVar85._0_4_ * fVar269);
                fVar127 = fVar127 - (auVar164._4_4_ * fVar245 + auVar164._0_4_ * fVar269);
                if ((auVar292._0_4_ <= ABS(fVar269)) ||
                   (local_458 * 1.9073486e-06 + fVar130 + auVar292._0_4_ <= ABS(fVar245))) {
                  bVar22 = false;
                }
                else {
                  fVar127 = fVar127 + (float)local_378._0_4_;
                  bVar22 = true;
                  if (fVar178 <= fVar127) {
                    fVar130 = *(float *)(ray + k * 4 + 0x80);
                    auVar292 = ZEXT416((uint)fVar130);
                    if (((fVar127 <= fVar130) && (0.0 <= fVar125)) && (fVar125 <= 1.0)) {
                      auVar85 = rsqrtss(_local_618,_local_618);
                      fVar162 = auVar85._0_4_;
                      pGVar18 = (context->scene->geometries).items[uVar78].ptr;
                      uVar65 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                      pRVar72 = (RTCIntersectArguments *)context;
                      if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar162 = fVar162 * 1.5 + fVar162 * fVar162 * local_418 * -0.5 * fVar162;
                        fVar206 = fVar206 * fVar162;
                        fVar207 = fVar207 * fVar162;
                        fVar195 = fVar195 * fVar162;
                        fVar209 = fVar247 * fVar206 + fVar231;
                        fVar232 = fVar247 * fVar207 + fVar235;
                        fVar245 = fVar247 * fVar195 + fVar246;
                        fVar247 = fVar207 * fVar231 - fVar235 * fVar206;
                        fVar207 = fVar195 * fVar235 - fVar246 * fVar207;
                        fVar195 = fVar206 * fVar246 - fVar231 * fVar195;
                        fVar162 = fVar232 * fVar207 - fVar195 * fVar209;
                        fVar195 = fVar245 * fVar195 - fVar247 * fVar232;
                        fVar206 = fVar209 * fVar247 - fVar207 * fVar245;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar127;
                          *(float *)(ray + k * 4 + 0xc0) = fVar195;
                          *(float *)(ray + k * 4 + 0xd0) = fVar206;
                          *(float *)(ray + k * 4 + 0xe0) = fVar162;
                          *(float *)(ray + k * 4 + 0xf0) = fVar125;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_3f0;
                          *(uint *)(ray + k * 4 + 0x120) = uVar78;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          uVar79 = context->user->instPrimID[0];
                          uVar65 = (ulong)uVar79;
                          *(uint *)(ray + k * 4 + 0x140) = uVar79;
                        }
                        else {
                          local_2c8._4_4_ = fVar195;
                          local_2c8._0_4_ = fVar195;
                          local_2c8._8_4_ = fVar195;
                          fStack_2bc = fVar195;
                          local_2b8 = fVar206;
                          fStack_2b4 = fVar206;
                          fStack_2b0 = fVar206;
                          fStack_2ac = fVar206;
                          local_2a8 = fVar162;
                          fStack_2a4 = fVar162;
                          fStack_2a0 = fVar162;
                          fStack_29c = fVar162;
                          local_298 = fVar125;
                          fStack_294 = fVar125;
                          fStack_290 = fVar125;
                          fStack_28c = fVar125;
                          local_288 = 0;
                          uStack_280 = 0;
                          local_278 = CONCAT44(uStack_334,local_338);
                          uStack_270 = CONCAT44(uStack_32c,uStack_330);
                          local_268 = CONCAT44(uStack_324,local_328);
                          uStack_260 = CONCAT44(uStack_31c,uStack_320);
                          local_258 = context->user->instID[0];
                          uStack_254 = local_258;
                          uStack_250 = local_258;
                          uStack_24c = local_258;
                          local_248 = context->user->instPrimID[0];
                          uStack_244 = local_248;
                          uStack_240 = local_248;
                          uStack_23c = local_248;
                          *(float *)(ray + k * 4 + 0x80) = fVar127;
                          local_548 = *local_3f8;
                          uStack_540 = local_3f8[1];
                          _local_528 = (int *)&local_548;
                          uStack_520 = pGVar18->userPtr;
                          local_518 = context->user;
                          local_510 = ray;
                          local_508 = (RTCIntersectArguments *)local_2c8;
                          local_500 = 4;
                          p_Var67 = pGVar18->intersectionFilterN;
                          if (p_Var67 != (RTCFilterFunctionN)0x0) {
                            p_Var67 = (RTCFilterFunctionN)
                                      (*p_Var67)((RTCFilterFunctionNArguments *)local_528);
                          }
                          auVar115._0_4_ = -(uint)((int)local_548 == 0);
                          auVar115._4_4_ = -(uint)(local_548._4_4_ == 0);
                          auVar115._8_4_ = -(uint)((int)uStack_540 == 0);
                          auVar115._12_4_ = -(uint)(uStack_540._4_4_ == 0);
                          uVar79 = movmskps((int)p_Var67,auVar115);
                          if ((uVar79 ^ 0xf) == 0) {
                            auVar115 = auVar115 ^ _DAT_01febe20;
                            pRVar69 = (RayHitK<4> *)(ulong)(uVar79 ^ 0xf);
                          }
                          else {
                            pRVar72 = context->args;
                            pRVar68 = (RTCIntersectArguments *)pRVar72->filter;
                            if ((pRVar68 != (RTCIntersectArguments *)0x0) &&
                               ((((ulong)*(Scene **)&pRVar72->flags & 2) != 0 ||
                                (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                              pRVar68 = (RTCIntersectArguments *)(*(code *)pRVar68)(local_528);
                            }
                            auVar152._0_4_ = -(uint)((int)local_548 == 0);
                            auVar152._4_4_ = -(uint)(local_548._4_4_ == 0);
                            auVar152._8_4_ = -(uint)((int)uStack_540 == 0);
                            auVar152._12_4_ = -(uint)(uStack_540._4_4_ == 0);
                            auVar115 = auVar152 ^ _DAT_01febe20;
                            uVar79 = movmskps((int)pRVar68,auVar152);
                            pRVar69 = (RayHitK<4> *)(ulong)(uVar79 ^ 0xf);
                            if ((uVar79 ^ 0xf) != 0) {
                              RVar26 = local_508->feature_mask;
                              uVar79 = *(uint *)&local_508->context;
                              uVar80 = *(uint *)((long)&local_508->context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0xc0) =
                                   ~auVar152._0_4_ & local_508->flags |
                                   *(uint *)(local_510 + 0xc0) & auVar152._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0xc4) =
                                   ~auVar152._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0xc4) & auVar152._4_4_;
                              *(uint *)(local_510 + 200) =
                                   ~auVar152._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 200) & auVar152._8_4_;
                              *(uint *)(local_510 + 0xcc) =
                                   ~auVar152._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0xcc) & auVar152._12_4_;
                              RVar26 = *(RTCFeatureFlags *)((long)&local_508->filter + 4);
                              uVar79 = *(uint *)&local_508->intersect;
                              uVar80 = *(uint *)((long)&local_508->intersect + 4);
                              *(uint *)(local_510 + 0xd0) =
                                   ~auVar152._0_4_ & *(uint *)&local_508->filter |
                                   *(uint *)(local_510 + 0xd0) & auVar152._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0xd4) =
                                   ~auVar152._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0xd4) & auVar152._4_4_;
                              *(uint *)(local_510 + 0xd8) =
                                   ~auVar152._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0xd8) & auVar152._8_4_;
                              *(uint *)(local_510 + 0xdc) =
                                   ~auVar152._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0xdc) & auVar152._12_4_;
                              RVar26 = local_508[1].feature_mask;
                              uVar79 = *(uint *)&local_508[1].context;
                              uVar80 = *(uint *)((long)&local_508[1].context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0xe0) =
                                   ~auVar152._0_4_ & local_508[1].flags |
                                   *(uint *)(local_510 + 0xe0) & auVar152._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0xe4) =
                                   ~auVar152._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0xe4) & auVar152._4_4_;
                              *(uint *)(local_510 + 0xe8) =
                                   ~auVar152._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0xe8) & auVar152._8_4_;
                              *(uint *)(local_510 + 0xec) =
                                   ~auVar152._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0xec) & auVar152._12_4_;
                              RVar26 = *(RTCFeatureFlags *)((long)&local_508[1].filter + 4);
                              uVar79 = *(uint *)&local_508[1].intersect;
                              uVar80 = *(uint *)((long)&local_508[1].intersect + 4);
                              *(uint *)(local_510 + 0xf0) =
                                   ~auVar152._0_4_ & *(uint *)&local_508[1].filter |
                                   *(uint *)(local_510 + 0xf0) & auVar152._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0xf4) =
                                   ~auVar152._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0xf4) & auVar152._4_4_;
                              *(uint *)(local_510 + 0xf8) =
                                   ~auVar152._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0xf8) & auVar152._8_4_;
                              *(uint *)(local_510 + 0xfc) =
                                   ~auVar152._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0xfc) & auVar152._12_4_;
                              RVar26 = local_508[2].feature_mask;
                              uVar79 = *(uint *)&local_508[2].context;
                              uVar80 = *(uint *)((long)&local_508[2].context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0x100) =
                                   ~auVar152._0_4_ & local_508[2].flags |
                                   *(uint *)(local_510 + 0x100) & auVar152._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0x104) =
                                   ~auVar152._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0x104) & auVar152._4_4_;
                              *(uint *)(local_510 + 0x108) =
                                   ~auVar152._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0x108) & auVar152._8_4_;
                              *(uint *)(local_510 + 0x10c) =
                                   ~auVar152._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0x10c) & auVar152._12_4_;
                              RVar26 = *(RTCFeatureFlags *)((long)&local_508[2].filter + 4);
                              uVar79 = *(uint *)&local_508[2].intersect;
                              uVar80 = *(uint *)((long)&local_508[2].intersect + 4);
                              *(uint *)(local_510 + 0x110) =
                                   *(uint *)(local_510 + 0x110) & auVar152._0_4_ |
                                   ~auVar152._0_4_ & *(uint *)&local_508[2].filter;
                              *(RTCFeatureFlags *)(local_510 + 0x114) =
                                   *(RTCFeatureFlags *)(local_510 + 0x114) & auVar152._4_4_ |
                                   ~auVar152._4_4_ & RVar26;
                              *(uint *)(local_510 + 0x118) =
                                   *(uint *)(local_510 + 0x118) & auVar152._8_4_ |
                                   ~auVar152._8_4_ & uVar79;
                              *(uint *)(local_510 + 0x11c) =
                                   *(uint *)(local_510 + 0x11c) & auVar152._12_4_ |
                                   ~auVar152._12_4_ & uVar80;
                              RVar26 = local_508[3].feature_mask;
                              uVar79 = *(uint *)&local_508[3].context;
                              uVar80 = *(uint *)((long)&local_508[3].context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0x120) =
                                   *(uint *)(local_510 + 0x120) & auVar152._0_4_ |
                                   ~auVar152._0_4_ & local_508[3].flags;
                              *(RTCFeatureFlags *)(local_510 + 0x124) =
                                   *(RTCFeatureFlags *)(local_510 + 0x124) & auVar152._4_4_ |
                                   ~auVar152._4_4_ & RVar26;
                              *(uint *)(local_510 + 0x128) =
                                   *(uint *)(local_510 + 0x128) & auVar152._8_4_ |
                                   ~auVar152._8_4_ & uVar79;
                              *(uint *)(local_510 + 300) =
                                   *(uint *)(local_510 + 300) & auVar152._12_4_ |
                                   ~auVar152._12_4_ & uVar80;
                              RVar26 = *(RTCFeatureFlags *)((long)&local_508[3].filter + 4);
                              uVar79 = *(uint *)&local_508[3].intersect;
                              uVar80 = *(uint *)((long)&local_508[3].intersect + 4);
                              *(uint *)(local_510 + 0x130) =
                                   ~auVar152._0_4_ & *(uint *)&local_508[3].filter |
                                   *(uint *)(local_510 + 0x130) & auVar152._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0x134) =
                                   ~auVar152._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0x134) & auVar152._4_4_;
                              *(uint *)(local_510 + 0x138) =
                                   ~auVar152._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0x138) & auVar152._8_4_;
                              *(uint *)(local_510 + 0x13c) =
                                   ~auVar152._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0x13c) & auVar152._12_4_;
                              RVar26 = local_508[4].feature_mask;
                              uVar79 = *(uint *)&local_508[4].context;
                              uVar80 = *(uint *)((long)&local_508[4].context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0x140) =
                                   ~auVar152._0_4_ & local_508[4].flags |
                                   *(uint *)(local_510 + 0x140) & auVar152._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0x144) =
                                   ~auVar152._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0x144) & auVar152._4_4_;
                              *(uint *)(local_510 + 0x148) =
                                   ~auVar152._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0x148) & auVar152._8_4_;
                              *(uint *)(local_510 + 0x14c) =
                                   ~auVar152._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0x14c) & auVar152._12_4_;
                              pRVar69 = local_510;
                              pRVar72 = local_508;
                            }
                          }
                          auVar292 = ZEXT416((uint)fVar130);
                          auVar116._0_4_ = auVar115._0_4_ << 0x1f;
                          auVar116._4_4_ = auVar115._4_4_ << 0x1f;
                          auVar116._8_4_ = auVar115._8_4_ << 0x1f;
                          auVar116._12_4_ = auVar115._12_4_ << 0x1f;
                          iVar62 = movmskps((int)pRVar69,auVar116);
                          uVar65 = CONCAT44((int)((ulong)pRVar69 >> 0x20),iVar62);
                          if (iVar62 == 0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar130;
                          }
                        }
                      }
                    }
                  }
                }
                bVar77 = lVar75 == 0;
                lVar75 = lVar75 + -1;
                uVar66 = CONCAT71((int7)(uVar65 >> 8),bVar77);
              } while ((!bVar22) && (!bVar77));
              fVar125 = *(float *)(ray + k * 4 + 0x80);
              local_3a8._0_4_ = -(uint)(local_478 <= fVar125) & local_3a8._0_4_;
              local_3a8._4_4_ = -(uint)(fStack_474 <= fVar125) & local_3a8._4_4_;
              local_3a8._8_4_ = -(uint)(fStack_470 <= fVar125) & local_3a8._8_4_;
              local_3a8._12_4_ = -(uint)(fStack_46c <= fVar125) & local_3a8._12_4_;
              uVar71 = (undefined4)(uVar65 >> 0x20);
              iVar62 = movmskps((int)uVar66,local_3a8);
            } while (iVar62 != 0);
          }
          auVar85 = _local_238;
          fVar125 = *(float *)(ray + k * 4 + 0x80);
          local_4b8._0_4_ = -(uint)((float)local_4b8._0_4_ + local_468 <= fVar125) & local_3e8._0_4_
          ;
          local_4b8._4_4_ =
               -(uint)((float)local_4b8._4_4_ + fStack_464 <= fVar125) & local_3e8._4_4_;
          fStack_4b0 = (float)(-(uint)(fStack_4b0 + fStack_460 <= fVar125) & (uint)fStack_3e0);
          fStack_4ac = (float)(-(uint)(fStack_4ac + fStack_45c <= fVar125) & (uint)fStack_3dc);
          local_4a8._0_4_ =
               -(uint)((int)local_398 <
                      ((int)((local_4a8._0_4_ & local_578._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4a8._4_4_ =
               -(uint)((int)fStack_394 <
                      ((int)((local_4a8._4_4_ & local_578._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4a0 = (float)-(uint)((int)fStack_390 <
                                     ((int)(((uint)fStack_4a0 & local_578._8_4_) << 0x1f) >> 0x1f) +
                                     4);
          fStack_49c = (float)-(uint)((int)fStack_38c <
                                     ((int)(((uint)fStack_49c & local_578._12_4_) << 0x1f) >> 0x1f)
                                     + 4);
          local_3b8 = ~_local_4a8 & _local_4b8;
          iVar62 = movmskps(iVar62,local_3b8);
          if (iVar62 != 0) {
            local_478 = local_468 + (float)local_238._0_4_;
            fStack_474 = fStack_464 + (float)local_238._4_4_;
            fStack_470 = fStack_460 + fStack_230;
            fStack_46c = fStack_45c + fStack_22c;
            do {
              auVar274 = ~local_3b8 & _DAT_01feb9f0 | local_3b8 & auVar85;
              auVar189._4_4_ = auVar274._0_4_;
              auVar189._0_4_ = auVar274._4_4_;
              auVar189._8_4_ = auVar274._12_4_;
              auVar189._12_4_ = auVar274._8_4_;
              auVar164 = minps(auVar189,auVar274);
              auVar153._0_8_ = auVar164._8_8_;
              auVar153._8_4_ = auVar164._0_4_;
              auVar153._12_4_ = auVar164._4_4_;
              auVar164 = minps(auVar153,auVar164);
              auVar154._0_8_ =
                   CONCAT44(-(uint)(auVar164._4_4_ == auVar274._4_4_) & local_3b8._4_4_,
                            -(uint)(auVar164._0_4_ == auVar274._0_4_) & local_3b8._0_4_);
              auVar154._8_4_ = -(uint)(auVar164._8_4_ == auVar274._8_4_) & local_3b8._8_4_;
              auVar154._12_4_ = -(uint)(auVar164._12_4_ == auVar274._12_4_) & local_3b8._12_4_;
              iVar62 = movmskps(iVar62,auVar154);
              auVar117 = local_3b8;
              if (iVar62 != 0) {
                auVar117._8_4_ = auVar154._8_4_;
                auVar117._0_8_ = auVar154._0_8_;
                auVar117._12_4_ = auVar154._12_4_;
              }
              uVar63 = movmskps(iVar62,auVar117);
              uVar66 = 0;
              if (CONCAT44(uVar71,uVar63) != 0) {
                for (; (CONCAT44(uVar71,uVar63) >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
                }
              }
              *(undefined4 *)(local_3b8 + uVar66 * 4) = 0;
              fVar125 = local_368[uVar66];
              fVar127 = *(float *)(local_228 + uVar66 * 4);
              fVar130 = SQRT(fVar161);
              if ((float)local_3d8._0_4_ < 0.0) {
                fVar130 = sqrtf((float)local_3d8._0_4_);
                uVar66 = extraout_RAX_03;
              }
              auVar31._4_4_ = fVar179;
              auVar31._0_4_ = fVar177;
              auVar31._8_4_ = fVar193;
              auVar31._12_4_ = fVar194;
              auVar35._4_4_ = fStack_4c4;
              auVar35._0_4_ = local_4c8;
              auVar35._8_4_ = fStack_4c0;
              auVar35._12_4_ = fStack_4bc;
              auVar274 = minps(auVar31,auVar35);
              auVar255 = maxps(auVar31,auVar35);
              auVar33._4_4_ = fStack_4d4;
              auVar33._0_4_ = local_4d8;
              auVar33._8_4_ = fStack_4d0;
              auVar33._12_4_ = fStack_4cc;
              auVar164 = minps(auVar33,_local_608);
              auVar274 = minps(auVar274,auVar164);
              auVar164 = maxps(auVar33,_local_608);
              auVar164 = maxps(auVar255,auVar164);
              auVar201._0_8_ = auVar274._0_8_ & 0x7fffffff7fffffff;
              auVar201._8_4_ = auVar274._8_4_ & 0x7fffffff;
              auVar201._12_4_ = auVar274._12_4_ & 0x7fffffff;
              local_458 = auVar164._12_4_;
              auVar118._0_8_ = auVar164._0_8_ & 0x7fffffff7fffffff;
              auVar118._8_4_ = auVar164._8_4_ & 0x7fffffff;
              auVar118._12_4_ = ABS(local_458);
              auVar164 = maxps(auVar201,auVar118);
              fVar160 = auVar164._4_4_;
              if (auVar164._4_4_ <= auVar164._0_4_) {
                fVar160 = auVar164._0_4_;
              }
              auVar202._8_8_ = auVar164._8_8_;
              auVar202._0_8_ = auVar164._8_8_;
              if (auVar164._8_4_ <= fVar160) {
                auVar202._0_4_ = fVar160;
              }
              fVar160 = auVar202._0_4_ * 1.9073486e-06;
              local_408 = fVar130 * 1.9073486e-06;
              fStack_454 = local_458;
              fStack_450 = local_458;
              fStack_44c = local_458;
              lVar75 = 4;
              do {
                auVar293._4_12_ = auVar292._4_12_;
                fVar258 = 1.0 - fVar125;
                fVar207 = local_4c8 * fVar258 + local_4d8 * fVar125;
                fVar209 = fStack_4c4 * fVar258 + fStack_4d4 * fVar125;
                fVar231 = fStack_4c0 * fVar258 + fStack_4d0 * fVar125;
                fVar235 = fStack_4bc * fVar258 + fStack_4cc * fVar125;
                fVar130 = (fVar177 * fVar258 + local_4c8 * fVar125) * fVar258 + fVar125 * fVar207;
                fVar162 = (fVar179 * fVar258 + fStack_4c4 * fVar125) * fVar258 + fVar125 * fVar209;
                fVar195 = (fVar193 * fVar258 + fStack_4c0 * fVar125) * fVar258 + fVar125 * fVar231;
                fVar206 = (fVar194 * fVar258 + fStack_4bc * fVar125) * fVar258 + fVar125 * fVar235;
                fVar207 = fVar207 * fVar258 +
                          (local_4d8 * fVar258 + (float)local_608._0_4_ * fVar125) * fVar125;
                fVar232 = fVar209 * fVar258 +
                          (fStack_4d4 * fVar258 + (float)local_608._4_4_ * fVar125) * fVar125;
                fVar245 = fVar231 * fVar258 +
                          (fStack_4d0 * fVar258 + fStack_600 * fVar125) * fVar125;
                fVar247 = fVar235 * fVar258 +
                          (fStack_4cc * fVar258 + fStack_5fc * fVar125) * fVar125;
                fVar209 = fVar258 * fVar206 + fVar125 * fVar247;
                fVar231 = (fVar207 - fVar130) * 3.0;
                fVar235 = (fVar232 - fVar162) * 3.0;
                fVar246 = (fVar245 - fVar195) * 3.0;
                fVar247 = (fVar247 - fVar206) * 3.0;
                fVar206 = (fVar127 * (float)local_3c8._0_4_ + 0.0) -
                          (fVar258 * fVar130 + fVar125 * fVar207);
                fVar207 = (fVar127 * (float)local_3c8._4_4_ + 0.0) -
                          (fVar258 * fVar162 + fVar125 * fVar232);
                fVar195 = (fVar127 * fStack_3c0 + 0.0) - (fVar258 * fVar195 + fVar125 * fVar245);
                fVar162 = (fVar127 * fStack_3bc + 0.0) - fVar209;
                fVar130 = fVar207 * fVar207;
                fStack_610 = fVar195 * fVar195;
                fStack_60c = fVar162 * fVar162;
                local_618._0_4_ = fVar130 + fVar206 * fVar206 + fStack_610;
                local_618._4_4_ = fVar130 + fVar130 + fStack_60c;
                fStack_610 = fVar130 + fStack_610 + fStack_610;
                fStack_60c = fVar130 + fStack_60c + fStack_60c;
                local_418 = (float)local_618._0_4_;
                if ((float)local_618._0_4_ < 0.0) {
                  fVar130 = sqrtf((float)local_618._0_4_);
                  auVar293._4_4_ = extraout_var_00._0_4_;
                  auVar293._0_4_ = fVar130;
                  auVar293._8_4_ = extraout_var_00._4_4_;
                  auVar293._12_4_ = extraout_var_00._8_4_;
                  uVar65 = extraout_RAX_04;
                }
                else {
                  auVar293._0_4_ = SQRT((float)local_618._0_4_);
                  uVar65 = uVar66;
                }
                fVar259 = fVar258 * 6.0;
                fVar130 = (fVar125 - (fVar258 + fVar258)) * 6.0;
                fVar245 = (fVar258 - (fVar125 + fVar125)) * 6.0;
                fVar232 = fVar125 * 6.0;
                fVar258 = fVar259 * fVar177 +
                          fVar130 * local_4c8 +
                          fVar245 * local_4d8 + fVar232 * (float)local_608._0_4_;
                fVar269 = fVar259 * fVar179 +
                          fVar130 * fStack_4c4 +
                          fVar245 * fStack_4d4 + fVar232 * (float)local_608._4_4_;
                fVar232 = fVar259 * fVar193 +
                          fVar130 * fStack_4c0 + fVar245 * fStack_4d0 + fVar232 * fStack_600;
                fVar130 = fVar160;
                if (fVar160 <= local_408 * fVar127) {
                  fVar130 = local_408 * fVar127;
                }
                fVar245 = fVar235 * fVar235 + fVar231 * fVar231 + fVar246 * fVar246;
                auVar274 = ZEXT416((uint)fVar245);
                auVar164 = rsqrtss(ZEXT416((uint)fVar245),auVar274);
                fVar259 = auVar164._0_4_;
                fVar259 = fVar259 * fVar259 * fVar245 * -0.5 * fVar259 + fVar259 * 1.5;
                fVar279 = fVar246 * fVar232 + fVar235 * fVar269 + fVar231 * fVar258;
                auVar164 = rcpss(auVar274,auVar274);
                fVar280 = (2.0 - fVar245 * auVar164._0_4_) * auVar164._0_4_;
                fVar323 = fVar231 * fVar259;
                fVar260 = fVar235 * fVar259;
                fVar267 = fVar246 * fVar259;
                fVar268 = fVar247 * fVar259;
                if (fVar245 < 0.0) {
                  fVar283 = sqrtf(fVar245);
                  auVar293 = ZEXT416(auVar293._0_4_);
                  uVar65 = extraout_RAX_05;
                }
                else {
                  fVar283 = SQRT(fVar245);
                }
                fVar296 = fVar207 * fVar260;
                fVar298 = fVar195 * fVar267;
                fVar301 = fVar162 * fVar268;
                fVar308 = fVar296 + fVar206 * fVar323 + fVar298;
                fVar309 = fVar296 + fVar296 + fVar301;
                fVar298 = fVar296 + fVar298 + fVar298;
                fVar301 = fVar296 + fVar301 + fVar301;
                auVar292._0_4_ =
                     (auVar293._0_4_ + 1.0) * (fVar160 / fVar283) +
                     auVar293._0_4_ * fVar160 + fVar130;
                auVar292._4_12_ = auVar293._4_12_;
                fVar283 = fStack_3bc * fVar268;
                fVar280 = fVar267 * -fVar246 + fVar260 * -fVar235 + fVar323 * -fVar231 +
                          fVar280 * (fVar245 * fVar232 - fVar279 * fVar246) * fVar259 * fVar195 +
                          fVar280 * (fVar245 * fVar269 - fVar279 * fVar235) * fVar259 * fVar207 +
                          fVar280 * (fVar245 * fVar258 - fVar279 * fVar231) * fVar259 * fVar206;
                fVar232 = fStack_3c0 * fVar267 +
                          (float)local_3c8._4_4_ * fVar260 + (float)local_3c8._0_4_ * fVar323;
                fVar245 = (float)local_618._0_4_ - fVar308 * fVar308;
                auVar119._0_8_ = CONCAT44((float)local_618._4_4_ - fVar309 * fVar309,fVar245);
                auVar119._8_4_ = fStack_610 - fVar298 * fVar298;
                auVar119._12_4_ = fStack_60c - fVar301 * fVar301;
                fVar279 = -fVar247 * fVar162;
                fVar259 = fStack_3c0 * fVar195;
                fVar162 = fStack_3bc * fVar162;
                fVar258 = (fVar259 +
                          (float)local_3c8._4_4_ * fVar207 + (float)local_3c8._0_4_ * fVar206) -
                          fVar308 * fVar232;
                auVar190._8_4_ = auVar119._8_4_;
                auVar190._0_8_ = auVar119._0_8_;
                auVar190._12_4_ = auVar119._12_4_;
                auVar164 = rsqrtss(auVar190,auVar119);
                fVar269 = auVar164._0_4_;
                auVar191._4_12_ = auVar164._4_12_;
                auVar191._0_4_ = fVar269 * fVar269 * fVar245 * -0.5 * fVar269 + fVar269 * 1.5;
                if (fVar245 < 0.0) {
                  _local_448 = auVar191;
                  local_438 = fVar232;
                  fStack_434 = fVar283;
                  fStack_430 = fStack_3c0 * fVar267;
                  fStack_42c = fVar283;
                  local_428 = fVar308;
                  fStack_424 = fVar309;
                  fStack_420 = fVar298;
                  fStack_41c = fVar301;
                  fVar245 = sqrtf(fVar245);
                  auVar292 = ZEXT416((uint)auVar292._0_4_);
                  uVar65 = extraout_RAX_06;
                  auVar191 = _local_448;
                  fVar269 = local_428;
                  fVar232 = local_438;
                  fVar283 = fStack_434;
                }
                else {
                  fVar245 = SQRT(fVar245);
                  fVar269 = fVar308;
                }
                fVar245 = fVar245 - fVar209;
                fVar209 = ((-fVar246 * fVar195 + -fVar235 * fVar207 + -fVar231 * fVar206) -
                          fVar308 * fVar280) * auVar191._0_4_ - fVar247;
                auVar29._4_4_ = fVar162;
                auVar29._0_4_ = fVar258;
                auVar29._8_4_ = fVar259;
                auVar29._12_4_ = fVar162;
                auVar172._4_12_ = auVar29._4_12_;
                auVar172._0_4_ = fVar258 * auVar191._0_4_;
                auVar243._0_8_ = CONCAT44(fVar279,fVar209) ^ 0x8000000080000000;
                auVar243._8_4_ = -fVar279;
                auVar243._12_4_ = fVar268 * -fVar247;
                auVar242._8_8_ = auVar243._8_8_;
                auVar242._0_8_ = CONCAT44(fVar280,fVar209) ^ 0x80000000;
                auVar319._0_4_ = fVar280 * auVar172._0_4_ - fVar232 * fVar209;
                auVar174._0_8_ = auVar172._0_8_;
                auVar174._8_4_ = fVar162;
                auVar174._12_4_ = -fVar283;
                auVar173._8_8_ = auVar174._8_8_;
                auVar173._0_8_ = CONCAT44(fVar232,auVar172._0_4_) ^ 0x8000000000000000;
                auVar319._4_4_ = auVar319._0_4_;
                auVar319._8_4_ = auVar319._0_4_;
                auVar319._12_4_ = auVar319._0_4_;
                auVar164 = divps(auVar173,auVar319);
                auVar274 = divps(auVar242,auVar319);
                fVar125 = fVar125 - (auVar164._4_4_ * fVar245 + auVar164._0_4_ * fVar269);
                fVar127 = fVar127 - (auVar274._4_4_ * fVar245 + auVar274._0_4_ * fVar269);
                if ((auVar292._0_4_ <= ABS(fVar269)) ||
                   (local_458 * 1.9073486e-06 + fVar130 + auVar292._0_4_ <= ABS(fVar245))) {
                  bVar22 = false;
                }
                else {
                  fVar127 = fVar127 + (float)local_378._0_4_;
                  bVar22 = true;
                  if (fVar178 <= fVar127) {
                    fVar130 = *(float *)(ray + k * 4 + 0x80);
                    auVar292 = ZEXT416((uint)fVar130);
                    if (((fVar127 <= fVar130) && (0.0 <= fVar125)) && (fVar125 <= 1.0)) {
                      auVar164 = rsqrtss(_local_618,_local_618);
                      fVar162 = auVar164._0_4_;
                      pGVar18 = (context->scene->geometries).items[uVar78].ptr;
                      uVar65 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                      pRVar72 = (RTCIntersectArguments *)context;
                      if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        fVar162 = fVar162 * 1.5 + fVar162 * fVar162 * local_418 * -0.5 * fVar162;
                        fVar206 = fVar206 * fVar162;
                        fVar207 = fVar207 * fVar162;
                        fVar195 = fVar195 * fVar162;
                        fVar209 = fVar247 * fVar206 + fVar231;
                        fVar232 = fVar247 * fVar207 + fVar235;
                        fVar245 = fVar247 * fVar195 + fVar246;
                        fVar247 = fVar207 * fVar231 - fVar235 * fVar206;
                        fVar207 = fVar195 * fVar235 - fVar246 * fVar207;
                        fVar195 = fVar206 * fVar246 - fVar231 * fVar195;
                        fVar162 = fVar232 * fVar207 - fVar195 * fVar209;
                        fVar195 = fVar245 * fVar195 - fVar247 * fVar232;
                        fVar206 = fVar209 * fVar247 - fVar207 * fVar245;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar18->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar127;
                          *(float *)(ray + k * 4 + 0xc0) = fVar195;
                          *(float *)(ray + k * 4 + 0xd0) = fVar206;
                          *(float *)(ray + k * 4 + 0xe0) = fVar162;
                          *(float *)(ray + k * 4 + 0xf0) = fVar125;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_3f0;
                          *(uint *)(ray + k * 4 + 0x120) = uVar78;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          uVar79 = context->user->instPrimID[0];
                          uVar65 = (ulong)uVar79;
                          *(uint *)(ray + k * 4 + 0x140) = uVar79;
                        }
                        else {
                          local_2c8._4_4_ = fVar195;
                          local_2c8._0_4_ = fVar195;
                          local_2c8._8_4_ = fVar195;
                          fStack_2bc = fVar195;
                          local_2b8 = fVar206;
                          fStack_2b4 = fVar206;
                          fStack_2b0 = fVar206;
                          fStack_2ac = fVar206;
                          local_2a8 = fVar162;
                          fStack_2a4 = fVar162;
                          fStack_2a0 = fVar162;
                          fStack_29c = fVar162;
                          local_298 = fVar125;
                          fStack_294 = fVar125;
                          fStack_290 = fVar125;
                          fStack_28c = fVar125;
                          local_288 = 0;
                          uStack_280 = 0;
                          local_278 = CONCAT44(uStack_334,local_338);
                          uStack_270 = CONCAT44(uStack_32c,uStack_330);
                          local_268 = CONCAT44(uStack_324,local_328);
                          uStack_260 = CONCAT44(uStack_31c,uStack_320);
                          local_258 = context->user->instID[0];
                          uStack_254 = local_258;
                          uStack_250 = local_258;
                          uStack_24c = local_258;
                          local_248 = context->user->instPrimID[0];
                          uStack_244 = local_248;
                          uStack_240 = local_248;
                          uStack_23c = local_248;
                          *(float *)(ray + k * 4 + 0x80) = fVar127;
                          local_548 = *local_3f8;
                          uStack_540 = local_3f8[1];
                          _local_528 = (int *)&local_548;
                          uStack_520 = pGVar18->userPtr;
                          local_518 = context->user;
                          local_510 = ray;
                          local_508 = (RTCIntersectArguments *)local_2c8;
                          local_500 = 4;
                          p_Var67 = pGVar18->intersectionFilterN;
                          if (p_Var67 != (RTCFilterFunctionN)0x0) {
                            p_Var67 = (RTCFilterFunctionN)
                                      (*p_Var67)((RTCFilterFunctionNArguments *)local_528);
                          }
                          auVar120._0_4_ = -(uint)((int)local_548 == 0);
                          auVar120._4_4_ = -(uint)(local_548._4_4_ == 0);
                          auVar120._8_4_ = -(uint)((int)uStack_540 == 0);
                          auVar120._12_4_ = -(uint)(uStack_540._4_4_ == 0);
                          uVar79 = movmskps((int)p_Var67,auVar120);
                          if ((uVar79 ^ 0xf) == 0) {
                            auVar120 = auVar120 ^ _DAT_01febe20;
                            pRVar69 = (RayHitK<4> *)(ulong)(uVar79 ^ 0xf);
                          }
                          else {
                            pRVar72 = context->args;
                            pRVar68 = (RTCIntersectArguments *)pRVar72->filter;
                            if ((pRVar68 != (RTCIntersectArguments *)0x0) &&
                               ((((ulong)*(Scene **)&pRVar72->flags & 2) != 0 ||
                                (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                              pRVar68 = (RTCIntersectArguments *)(*(code *)pRVar68)(local_528);
                            }
                            auVar155._0_4_ = -(uint)((int)local_548 == 0);
                            auVar155._4_4_ = -(uint)(local_548._4_4_ == 0);
                            auVar155._8_4_ = -(uint)((int)uStack_540 == 0);
                            auVar155._12_4_ = -(uint)(uStack_540._4_4_ == 0);
                            auVar120 = auVar155 ^ _DAT_01febe20;
                            uVar79 = movmskps((int)pRVar68,auVar155);
                            pRVar69 = (RayHitK<4> *)(ulong)(uVar79 ^ 0xf);
                            if ((uVar79 ^ 0xf) != 0) {
                              RVar26 = local_508->feature_mask;
                              uVar79 = *(uint *)&local_508->context;
                              uVar80 = *(uint *)((long)&local_508->context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0xc0) =
                                   ~auVar155._0_4_ & local_508->flags |
                                   *(uint *)(local_510 + 0xc0) & auVar155._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0xc4) =
                                   ~auVar155._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0xc4) & auVar155._4_4_;
                              *(uint *)(local_510 + 200) =
                                   ~auVar155._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 200) & auVar155._8_4_;
                              *(uint *)(local_510 + 0xcc) =
                                   ~auVar155._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0xcc) & auVar155._12_4_;
                              RVar26 = *(RTCFeatureFlags *)((long)&local_508->filter + 4);
                              uVar79 = *(uint *)&local_508->intersect;
                              uVar80 = *(uint *)((long)&local_508->intersect + 4);
                              *(uint *)(local_510 + 0xd0) =
                                   ~auVar155._0_4_ & *(uint *)&local_508->filter |
                                   *(uint *)(local_510 + 0xd0) & auVar155._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0xd4) =
                                   ~auVar155._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0xd4) & auVar155._4_4_;
                              *(uint *)(local_510 + 0xd8) =
                                   ~auVar155._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0xd8) & auVar155._8_4_;
                              *(uint *)(local_510 + 0xdc) =
                                   ~auVar155._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0xdc) & auVar155._12_4_;
                              RVar26 = local_508[1].feature_mask;
                              uVar79 = *(uint *)&local_508[1].context;
                              uVar80 = *(uint *)((long)&local_508[1].context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0xe0) =
                                   ~auVar155._0_4_ & local_508[1].flags |
                                   *(uint *)(local_510 + 0xe0) & auVar155._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0xe4) =
                                   ~auVar155._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0xe4) & auVar155._4_4_;
                              *(uint *)(local_510 + 0xe8) =
                                   ~auVar155._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0xe8) & auVar155._8_4_;
                              *(uint *)(local_510 + 0xec) =
                                   ~auVar155._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0xec) & auVar155._12_4_;
                              RVar26 = *(RTCFeatureFlags *)((long)&local_508[1].filter + 4);
                              uVar79 = *(uint *)&local_508[1].intersect;
                              uVar80 = *(uint *)((long)&local_508[1].intersect + 4);
                              *(uint *)(local_510 + 0xf0) =
                                   ~auVar155._0_4_ & *(uint *)&local_508[1].filter |
                                   *(uint *)(local_510 + 0xf0) & auVar155._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0xf4) =
                                   ~auVar155._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0xf4) & auVar155._4_4_;
                              *(uint *)(local_510 + 0xf8) =
                                   ~auVar155._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0xf8) & auVar155._8_4_;
                              *(uint *)(local_510 + 0xfc) =
                                   ~auVar155._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0xfc) & auVar155._12_4_;
                              RVar26 = local_508[2].feature_mask;
                              uVar79 = *(uint *)&local_508[2].context;
                              uVar80 = *(uint *)((long)&local_508[2].context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0x100) =
                                   ~auVar155._0_4_ & local_508[2].flags |
                                   *(uint *)(local_510 + 0x100) & auVar155._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0x104) =
                                   ~auVar155._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0x104) & auVar155._4_4_;
                              *(uint *)(local_510 + 0x108) =
                                   ~auVar155._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0x108) & auVar155._8_4_;
                              *(uint *)(local_510 + 0x10c) =
                                   ~auVar155._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0x10c) & auVar155._12_4_;
                              RVar26 = *(RTCFeatureFlags *)((long)&local_508[2].filter + 4);
                              uVar79 = *(uint *)&local_508[2].intersect;
                              uVar80 = *(uint *)((long)&local_508[2].intersect + 4);
                              *(uint *)(local_510 + 0x110) =
                                   *(uint *)(local_510 + 0x110) & auVar155._0_4_ |
                                   ~auVar155._0_4_ & *(uint *)&local_508[2].filter;
                              *(RTCFeatureFlags *)(local_510 + 0x114) =
                                   *(RTCFeatureFlags *)(local_510 + 0x114) & auVar155._4_4_ |
                                   ~auVar155._4_4_ & RVar26;
                              *(uint *)(local_510 + 0x118) =
                                   *(uint *)(local_510 + 0x118) & auVar155._8_4_ |
                                   ~auVar155._8_4_ & uVar79;
                              *(uint *)(local_510 + 0x11c) =
                                   *(uint *)(local_510 + 0x11c) & auVar155._12_4_ |
                                   ~auVar155._12_4_ & uVar80;
                              RVar26 = local_508[3].feature_mask;
                              uVar79 = *(uint *)&local_508[3].context;
                              uVar80 = *(uint *)((long)&local_508[3].context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0x120) =
                                   *(uint *)(local_510 + 0x120) & auVar155._0_4_ |
                                   ~auVar155._0_4_ & local_508[3].flags;
                              *(RTCFeatureFlags *)(local_510 + 0x124) =
                                   *(RTCFeatureFlags *)(local_510 + 0x124) & auVar155._4_4_ |
                                   ~auVar155._4_4_ & RVar26;
                              *(uint *)(local_510 + 0x128) =
                                   *(uint *)(local_510 + 0x128) & auVar155._8_4_ |
                                   ~auVar155._8_4_ & uVar79;
                              *(uint *)(local_510 + 300) =
                                   *(uint *)(local_510 + 300) & auVar155._12_4_ |
                                   ~auVar155._12_4_ & uVar80;
                              RVar26 = *(RTCFeatureFlags *)((long)&local_508[3].filter + 4);
                              uVar79 = *(uint *)&local_508[3].intersect;
                              uVar80 = *(uint *)((long)&local_508[3].intersect + 4);
                              *(uint *)(local_510 + 0x130) =
                                   ~auVar155._0_4_ & *(uint *)&local_508[3].filter |
                                   *(uint *)(local_510 + 0x130) & auVar155._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0x134) =
                                   ~auVar155._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0x134) & auVar155._4_4_;
                              *(uint *)(local_510 + 0x138) =
                                   ~auVar155._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0x138) & auVar155._8_4_;
                              *(uint *)(local_510 + 0x13c) =
                                   ~auVar155._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0x13c) & auVar155._12_4_;
                              RVar26 = local_508[4].feature_mask;
                              uVar79 = *(uint *)&local_508[4].context;
                              uVar80 = *(uint *)((long)&local_508[4].context + 4);
                              *(RTCRayQueryFlags *)(local_510 + 0x140) =
                                   ~auVar155._0_4_ & local_508[4].flags |
                                   *(uint *)(local_510 + 0x140) & auVar155._0_4_;
                              *(RTCFeatureFlags *)(local_510 + 0x144) =
                                   ~auVar155._4_4_ & RVar26 |
                                   *(RTCFeatureFlags *)(local_510 + 0x144) & auVar155._4_4_;
                              *(uint *)(local_510 + 0x148) =
                                   ~auVar155._8_4_ & uVar79 |
                                   *(uint *)(local_510 + 0x148) & auVar155._8_4_;
                              *(uint *)(local_510 + 0x14c) =
                                   ~auVar155._12_4_ & uVar80 |
                                   *(uint *)(local_510 + 0x14c) & auVar155._12_4_;
                              pRVar69 = local_510;
                              pRVar72 = local_508;
                            }
                          }
                          auVar292 = ZEXT416((uint)fVar130);
                          auVar121._0_4_ = auVar120._0_4_ << 0x1f;
                          auVar121._4_4_ = auVar120._4_4_ << 0x1f;
                          auVar121._8_4_ = auVar120._8_4_ << 0x1f;
                          auVar121._12_4_ = auVar120._12_4_ << 0x1f;
                          iVar62 = movmskps((int)pRVar69,auVar121);
                          uVar65 = CONCAT44((int)((ulong)pRVar69 >> 0x20),iVar62);
                          if (iVar62 == 0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar130;
                          }
                        }
                      }
                    }
                  }
                }
                bVar77 = lVar75 == 0;
                lVar75 = lVar75 + -1;
                uVar66 = CONCAT71((int7)(uVar65 >> 8),bVar77);
              } while ((!bVar22) && (!bVar77));
              fVar125 = *(float *)(ray + k * 4 + 0x80);
              local_3b8._0_4_ = -(uint)(local_478 <= fVar125) & local_3b8._0_4_;
              local_3b8._4_4_ = -(uint)(fStack_474 <= fVar125) & local_3b8._4_4_;
              local_3b8._8_4_ = -(uint)(fStack_470 <= fVar125) & local_3b8._8_4_;
              local_3b8._12_4_ = -(uint)(fStack_46c <= fVar125) & local_3b8._12_4_;
              uVar71 = (undefined4)(uVar65 >> 0x20);
              iVar62 = movmskps((int)uVar66,local_3b8);
            } while (iVar62 != 0);
          }
          fVar125 = *(float *)(ray + k * 4 + 0x80);
          auVar203._0_4_ =
               local_4f8._0_4_ & local_388._0_4_ &
               -(uint)(local_468 + (float)local_118._0_4_ <= fVar125);
          auVar203._4_4_ =
               local_4f8._4_4_ & local_388._4_4_ &
               -(uint)(fStack_464 + (float)local_118._4_4_ <= fVar125);
          auVar203._8_4_ =
               (uint)fStack_4f0 & (uint)fStack_380 & -(uint)(fStack_460 + fStack_110 <= fVar125);
          auVar203._12_4_ =
               (uint)fStack_4ec & (uint)fStack_37c & -(uint)(fStack_45c + fStack_10c <= fVar125);
          auVar175._0_4_ =
               local_4a8._0_4_ & local_4b8._0_4_ &
               -(uint)(local_468 + (float)local_238._0_4_ <= fVar125);
          auVar175._4_4_ =
               local_4a8._4_4_ & local_4b8._4_4_ &
               -(uint)(fStack_464 + (float)local_238._4_4_ <= fVar125);
          auVar175._8_4_ =
               (uint)fStack_4a0 & (uint)fStack_4b0 & -(uint)(fStack_460 + fStack_230 <= fVar125);
          auVar175._12_4_ =
               (uint)fStack_49c & (uint)fStack_4ac & -(uint)(fStack_45c + fStack_22c <= fVar125);
          iVar62 = movmskps(iVar62,auVar175 | auVar203);
          fVar125 = local_498;
          fVar127 = fStack_494;
          uVar63 = uStack_490;
          uVar208 = uStack_48c;
          if (iVar62 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar70 * 0xc) = auVar175 | auVar203;
            afStack_e8[uVar70 * 0xc] =
                 (float)(~auVar203._0_4_ & local_238._0_4_ | local_118._0_4_ & auVar203._0_4_);
            afStack_e8[uVar70 * 0xc + 1] =
                 (float)(~auVar203._4_4_ & local_238._4_4_ | local_118._4_4_ & auVar203._4_4_);
            afStack_e8[uVar70 * 0xc + 2] =
                 (float)(~auVar203._8_4_ & (uint)fStack_230 | (uint)fStack_110 & auVar203._8_4_);
            afStack_e8[uVar70 * 0xc + 3] =
                 (float)(~auVar203._12_4_ & (uint)fStack_22c | (uint)fStack_10c & auVar203._12_4_);
            afStack_d0[uVar70 * 0xc + -2] = local_498;
            afStack_d0[uVar70 * 0xc + -1] = fStack_494;
            fVar130 = (float)((int)local_530 + 1);
            pRVar72 = (RTCIntersectArguments *)(ulong)(uint)fVar130;
            afStack_d0[uVar70 * 0xc] = fVar130;
            uVar70 = (ulong)((int)uVar70 + 1);
          }
        }
      }
    }
    do {
      uVar79 = (uint)uVar70;
      if (uVar79 == 0) {
        fVar178 = *(float *)(ray + k * 4 + 0x80);
        auVar159._4_4_ = -(uint)(fStack_214 <= fVar178);
        auVar159._0_4_ = -(uint)(local_218 <= fVar178);
        auVar159._8_4_ = -(uint)(fStack_210 <= fVar178);
        auVar159._12_4_ = -(uint)(fStack_20c <= fVar178);
        uVar78 = movmskps((int)pRVar72,auVar159);
        uVar78 = (uint)local_340 - 1 & (uint)local_340 & uVar78;
        if (uVar78 == 0) {
          return;
        }
        goto LAB_00bbd672;
      }
      uVar70 = (ulong)(uVar79 - 1);
      fVar130 = *(float *)(ray + k * 4 + 0x80);
      auVar122._0_4_ =
           -(uint)(local_468 + afStack_e8[uVar70 * 0xc] <= fVar130) & auStack_f8[uVar70 * 0xc];
      auVar122._4_4_ =
           -(uint)(fStack_464 + afStack_e8[uVar70 * 0xc + 1] <= fVar130) &
           auStack_f8[uVar70 * 0xc + 1];
      auVar122._8_4_ =
           -(uint)(fStack_460 + afStack_e8[uVar70 * 0xc + 2] <= fVar130) &
           auStack_f8[uVar70 * 0xc + 2];
      auVar122._12_4_ =
           -(uint)(fStack_45c + afStack_e8[uVar70 * 0xc + 3] <= fVar130) &
           (uint)afStack_e8[uVar70 * 0xc + -1];
      _local_2c8 = auVar122;
      uVar80 = movmskps((int)pRVar72,auVar122);
      pRVar72 = (RTCIntersectArguments *)(ulong)uVar80;
      if (uVar80 != 0) {
        auVar156._0_4_ = (uint)afStack_e8[uVar70 * 0xc] & auVar122._0_4_;
        auVar156._4_4_ = (uint)afStack_e8[uVar70 * 0xc + 1] & auVar122._4_4_;
        auVar156._8_4_ = (uint)afStack_e8[uVar70 * 0xc + 2] & auVar122._8_4_;
        auVar156._12_4_ = (uint)afStack_e8[uVar70 * 0xc + 3] & auVar122._12_4_;
        auVar176._0_8_ = CONCAT44(~auVar122._4_4_,~auVar122._0_4_) & 0x7f8000007f800000;
        auVar176._8_4_ = ~auVar122._8_4_ & 0x7f800000;
        auVar176._12_4_ = ~auVar122._12_4_ & 0x7f800000;
        auVar176 = auVar176 | auVar156;
        auVar192._4_4_ = auVar176._0_4_;
        auVar192._0_4_ = auVar176._4_4_;
        auVar192._8_4_ = auVar176._12_4_;
        auVar192._12_4_ = auVar176._8_4_;
        auVar85 = minps(auVar192,auVar176);
        auVar157._0_8_ = auVar85._8_8_;
        auVar157._8_4_ = auVar85._0_4_;
        auVar157._12_4_ = auVar85._4_4_;
        auVar85 = minps(auVar157,auVar85);
        auVar158._0_8_ =
             CONCAT44(-(uint)(auVar85._4_4_ == auVar176._4_4_) & auVar122._4_4_,
                      -(uint)(auVar85._0_4_ == auVar176._0_4_) & auVar122._0_4_);
        auVar158._8_4_ = -(uint)(auVar85._8_4_ == auVar176._8_4_) & auVar122._8_4_;
        auVar158._12_4_ = -(uint)(auVar85._12_4_ == auVar176._12_4_) & auVar122._12_4_;
        iVar62 = movmskps((int)lVar76,auVar158);
        if (iVar62 != 0) {
          auVar122._8_4_ = auVar158._8_4_;
          auVar122._0_8_ = auVar158._0_8_;
          auVar122._12_4_ = auVar158._12_4_;
        }
        fVar125 = afStack_d0[uVar70 * 0xc + -2];
        fVar127 = afStack_d0[uVar70 * 0xc + -1];
        local_530 = (ulong)(uint)afStack_d0[uVar70 * 0xc];
        uVar81 = movmskps(afStack_d0[uVar70 * 0xc],auVar122);
        lVar76 = 0;
        if (uVar81 != 0) {
          for (; (uVar81 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
          }
        }
        *(undefined4 *)(local_2c8 + lVar76 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar70 * 0xc) = _local_2c8;
        iVar62 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar70 * 0xc),_local_2c8);
        if (iVar62 == 0) {
          uVar79 = uVar79 - 1;
        }
        fVar127 = fVar127 - fVar125;
        _local_528 = (int *)CONCAT44(fVar127 * 0.33333334 + fVar125,fVar127 * 0.0 + fVar125);
        uStack_520 = (void *)CONCAT44(fVar127 * 1.0 + fVar125,fVar127 * 0.6666667 + fVar125);
        fVar125 = *(float *)(local_528 + lVar76 * 4);
        fVar127 = *(float *)(local_528 + lVar76 * 4 + 4);
        uVar63 = 0;
        uVar208 = 0;
        uVar70 = (ulong)uVar79;
      }
      uVar66 = uVar70;
    } while ((char)uVar80 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }